

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subdivpatch1base_eval.cpp
# Opt level: O2

Vec3<embree::vfloat_impl<8>_> *
embree::avx::patchEval<embree::vfloat_impl<8>>
          (SubdivPatch1Base *patch,vfloat_impl<8> *uu,vfloat_impl<8> *vv)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  Vec3<embree::vfloat_impl<8>_> *in_RDI;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar26;
  float fVar27;
  float fVar30;
  float fVar32;
  float fVar33;
  undefined1 auVar22 [16];
  float fVar25;
  float fVar28;
  float fVar29;
  float fVar31;
  float fVar34;
  float fVar35;
  float fVar38;
  float fVar39;
  float fVar42;
  float fVar43;
  float fVar46;
  undefined1 auVar23 [32];
  float fVar36;
  float fVar37;
  float fVar40;
  float fVar41;
  float fVar44;
  float fVar45;
  float fVar47;
  undefined1 auVar24 [32];
  float fVar48;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  float in_register_0000125c;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar57;
  float fVar61;
  float fVar62;
  undefined1 auVar52 [32];
  float fVar64;
  float in_register_0000129c;
  float fVar65;
  undefined1 auVar63 [32];
  float fVar66;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float in_register_000012dc;
  float fVar75;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar76;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float fVar87;
  float fVar88;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float in_register_0000139c;
  undefined1 auVar89 [32];
  float fVar101;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  undefined1 auVar102 [32];
  float in_register_0000141c;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float in_register_0000145c;
  float fVar117;
  float fVar118;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar119 [28];
  float fVar125;
  float in_register_0000149c;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  float in_register_000015dc;
  undefined1 auVar140 [32];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  
  switch(patch->type) {
  case '\x01':
    auVar52 = *(undefined1 (*) [32])(uu->field_0).v;
    auVar102._8_4_ = 0x3f800000;
    auVar102._0_8_ = 0x3f8000003f800000;
    auVar102._12_4_ = 0x3f800000;
    auVar102._16_4_ = 0x3f800000;
    auVar102._20_4_ = 0x3f800000;
    auVar102._24_4_ = 0x3f800000;
    auVar102._28_4_ = 0x3f800000;
    auVar79 = vsubps_avx(auVar102,auVar52);
    fVar48 = auVar79._0_4_;
    fVar28 = auVar79._4_4_;
    fVar34 = auVar79._8_4_;
    fVar42 = auVar79._12_4_;
    fVar91 = auVar79._16_4_;
    fVar95 = auVar79._20_4_;
    fVar99 = auVar79._24_4_;
    fVar35 = fVar48 * fVar48 * fVar48;
    fVar36 = fVar28 * fVar28 * fVar28;
    fVar64 = fVar34 * fVar34 * fVar34;
    fVar20 = fVar42 * fVar42 * fVar42;
    fVar85 = fVar91 * fVar91 * fVar91;
    fVar40 = fVar95 * fVar95 * fVar95;
    fVar41 = fVar99 * fVar99 * fVar99;
    fVar21 = auVar52._0_4_;
    fVar31 = auVar52._4_4_;
    fVar38 = auVar52._8_4_;
    fVar46 = auVar52._12_4_;
    fVar93 = auVar52._16_4_;
    fVar97 = auVar52._20_4_;
    fVar43 = auVar52._24_4_;
    fVar37 = fVar21 * fVar21 * fVar21;
    fVar86 = fVar31 * fVar31 * fVar31;
    fVar44 = fVar38 * fVar38 * fVar38;
    fVar45 = fVar46 * fVar46 * fVar46;
    fVar62 = fVar93 * fVar93 * fVar93;
    fVar47 = fVar97 * fVar97 * fVar97;
    fVar75 = fVar43 * fVar43 * fVar43;
    fVar137 = fVar48 * fVar21 * fVar48;
    fVar53 = fVar28 * fVar31 * fVar28;
    fVar55 = fVar34 * fVar38 * fVar34;
    fVar56 = fVar42 * fVar46 * fVar42;
    fVar76 = fVar91 * fVar93 * fVar91;
    fVar18 = fVar95 * fVar97 * fVar95;
    fVar60 = fVar99 * fVar43 * fVar99;
    fVar21 = fVar21 * fVar21 * fVar48;
    fVar31 = fVar31 * fVar31 * fVar28;
    fVar38 = fVar38 * fVar38 * fVar34;
    fVar46 = fVar46 * fVar46 * fVar42;
    fVar93 = fVar93 * fVar93 * fVar91;
    fVar97 = fVar97 * fVar97 * fVar95;
    fVar43 = fVar43 * fVar43 * fVar99;
    fVar48 = auVar52._28_4_ + auVar79._28_4_;
    fVar19 = fVar35 * 0.16666667;
    fVar25 = fVar36 * 0.16666667;
    fVar81 = fVar64 * 0.16666667;
    fVar26 = fVar20 * 0.16666667;
    fVar27 = fVar85 * 0.16666667;
    fVar39 = fVar40 * 0.16666667;
    fVar82 = fVar41 * 0.16666667;
    fVar29 = (fVar137 * 12.0 + fVar21 * 6.0 + fVar37 + fVar35 * 4.0) * 0.16666667;
    fVar30 = (fVar53 * 12.0 + fVar31 * 6.0 + fVar86 + fVar36 * 4.0) * 0.16666667;
    fVar54 = (fVar55 * 12.0 + fVar38 * 6.0 + fVar44 + fVar64 * 4.0) * 0.16666667;
    fVar83 = (fVar56 * 12.0 + fVar46 * 6.0 + fVar45 + fVar20 * 4.0) * 0.16666667;
    fVar32 = (fVar76 * 12.0 + fVar93 * 6.0 + fVar62 + fVar85 * 4.0) * 0.16666667;
    fVar33 = (fVar18 * 12.0 + fVar97 * 6.0 + fVar47 + fVar40 * 4.0) * 0.16666667;
    fVar84 = (fVar60 * 12.0 + fVar43 * 6.0 + fVar75 + fVar41 * 4.0) * 0.16666667;
    fVar35 = (fVar37 * 4.0 + fVar35 + fVar21 * 12.0 + fVar137 * 6.0) * 0.16666667;
    fVar36 = (fVar86 * 4.0 + fVar36 + fVar31 * 12.0 + fVar53 * 6.0) * 0.16666667;
    fVar64 = (fVar44 * 4.0 + fVar64 + fVar38 * 12.0 + fVar55 * 6.0) * 0.16666667;
    fVar20 = (fVar45 * 4.0 + fVar20 + fVar46 * 12.0 + fVar56 * 6.0) * 0.16666667;
    fVar85 = (fVar62 * 4.0 + fVar85 + fVar93 * 12.0 + fVar76 * 6.0) * 0.16666667;
    fVar40 = (fVar47 * 4.0 + fVar40 + fVar97 * 12.0 + fVar18 * 6.0) * 0.16666667;
    fVar60 = (fVar75 * 4.0 + fVar41 + fVar43 * 12.0 + fVar60 * 6.0) * 0.16666667;
    fVar37 = fVar37 * 0.16666667;
    fVar86 = fVar86 * 0.16666667;
    fVar44 = fVar44 * 0.16666667;
    fVar45 = fVar45 * 0.16666667;
    fVar62 = fVar62 * 0.16666667;
    fVar47 = fVar47 * 0.16666667;
    fVar75 = fVar75 * 0.16666667;
    auVar52 = *(undefined1 (*) [32])(vv->field_0).v;
    auVar24 = vsubps_avx(auVar102,auVar52);
    fVar21 = auVar24._0_4_;
    fVar31 = auVar24._4_4_;
    fVar38 = auVar24._8_4_;
    fVar46 = auVar24._12_4_;
    fVar93 = auVar24._16_4_;
    fVar97 = auVar24._20_4_;
    fVar43 = auVar24._24_4_;
    fVar88 = fVar21 * fVar21 * fVar21;
    fVar90 = fVar31 * fVar31 * fVar31;
    fVar92 = fVar38 * fVar38 * fVar38;
    fVar94 = fVar46 * fVar46 * fVar46;
    fVar96 = fVar93 * fVar93 * fVar93;
    fVar105 = fVar97 * fVar97 * fVar97;
    fVar132 = fVar43 * fVar43 * fVar43;
    fVar28 = auVar52._0_4_;
    fVar34 = auVar52._4_4_;
    fVar42 = auVar52._8_4_;
    fVar91 = auVar52._12_4_;
    fVar95 = auVar52._16_4_;
    fVar99 = auVar52._20_4_;
    fVar137 = auVar52._24_4_;
    fVar126 = fVar28 * fVar28 * fVar28;
    fVar101 = fVar34 * fVar34 * fVar34;
    fVar127 = fVar42 * fVar42 * fVar42;
    fVar103 = fVar91 * fVar91 * fVar91;
    fVar128 = fVar95 * fVar95 * fVar95;
    fVar104 = fVar99 * fVar99 * fVar99;
    fVar130 = fVar137 * fVar137 * fVar137;
    fVar53 = fVar28 * fVar21 * fVar21;
    fVar55 = fVar34 * fVar31 * fVar31;
    fVar56 = fVar42 * fVar38 * fVar38;
    fVar76 = fVar91 * fVar46 * fVar46;
    fVar18 = fVar95 * fVar93 * fVar93;
    fVar98 = fVar99 * fVar97 * fVar97;
    fVar100 = fVar137 * fVar43 * fVar43;
    fVar28 = fVar28 * fVar28 * fVar21;
    fVar34 = fVar34 * fVar34 * fVar31;
    fVar42 = fVar42 * fVar42 * fVar38;
    fVar91 = fVar91 * fVar91 * fVar46;
    fVar95 = fVar95 * fVar95 * fVar93;
    fVar99 = fVar99 * fVar99 * fVar97;
    fVar137 = fVar137 * fVar137 * fVar43;
    fVar41 = fVar88 * 0.16666667;
    fVar57 = fVar90 * 0.16666667;
    fVar58 = fVar92 * 0.16666667;
    fVar59 = fVar94 * 0.16666667;
    fVar61 = fVar96 * 0.16666667;
    fVar65 = fVar105 * 0.16666667;
    fVar66 = fVar132 * 0.16666667;
    fVar69 = (fVar126 + fVar88 * 4.0 + fVar53 * 12.0 + fVar28 * 6.0) * 0.16666667;
    fVar70 = (fVar101 + fVar90 * 4.0 + fVar55 * 12.0 + fVar34 * 6.0) * 0.16666667;
    fVar71 = (fVar127 + fVar92 * 4.0 + fVar56 * 12.0 + fVar42 * 6.0) * 0.16666667;
    fVar72 = (fVar103 + fVar94 * 4.0 + fVar76 * 12.0 + fVar91 * 6.0) * 0.16666667;
    fVar73 = (fVar128 + fVar96 * 4.0 + fVar18 * 12.0 + fVar95 * 6.0) * 0.16666667;
    fVar74 = (fVar104 + fVar105 * 4.0 + fVar98 * 12.0 + fVar99 * 6.0) * 0.16666667;
    fVar87 = (fVar130 + fVar132 * 4.0 + fVar100 * 12.0 + fVar137 * 6.0) * 0.16666667;
    fVar88 = (fVar88 + fVar126 * 4.0 + fVar28 * 12.0 + fVar53 * 6.0) * 0.16666667;
    fVar90 = (fVar90 + fVar101 * 4.0 + fVar34 * 12.0 + fVar55 * 6.0) * 0.16666667;
    fVar92 = (fVar92 + fVar127 * 4.0 + fVar42 * 12.0 + fVar56 * 6.0) * 0.16666667;
    fVar94 = (fVar94 + fVar103 * 4.0 + fVar91 * 12.0 + fVar76 * 6.0) * 0.16666667;
    fVar96 = (fVar96 + fVar128 * 4.0 + fVar95 * 12.0 + fVar18 * 6.0) * 0.16666667;
    fVar98 = (fVar105 + fVar104 * 4.0 + fVar99 * 12.0 + fVar98 * 6.0) * 0.16666667;
    fVar100 = (fVar132 + fVar130 * 4.0 + fVar137 * 12.0 + fVar100 * 6.0) * 0.16666667;
    fVar126 = fVar126 * 0.16666667;
    fVar101 = fVar101 * 0.16666667;
    fVar127 = fVar127 * 0.16666667;
    fVar103 = fVar103 * 0.16666667;
    fVar128 = fVar128 * 0.16666667;
    fVar104 = fVar104 * 0.16666667;
    fVar130 = fVar130 * 0.16666667;
    fVar21 = patch->patch_v[0][0].field_0.m128[0];
    fVar28 = patch->patch_v[1][0].field_0.m128[0];
    fVar31 = patch->patch_v[2][0].field_0.m128[0];
    fVar34 = patch->patch_v[3][0].field_0.m128[0];
    fVar38 = patch->patch_v[0][1].field_0.m128[0];
    fVar42 = patch->patch_v[1][1].field_0.m128[0];
    fVar46 = patch->patch_v[2][1].field_0.m128[0];
    fVar91 = patch->patch_v[3][1].field_0.m128[0];
    fVar93 = patch->patch_v[0][2].field_0.m128[0];
    fVar95 = patch->patch_v[1][2].field_0.m128[0];
    fVar97 = patch->patch_v[2][2].field_0.m128[0];
    fVar99 = patch->patch_v[3][2].field_0.m128[0];
    fVar109 = fVar95 + fVar97 + fVar99;
    fVar43 = patch->patch_v[0][3].field_0.m128[0];
    fVar137 = patch->patch_v[1][3].field_0.m128[0];
    fVar53 = patch->patch_v[2][3].field_0.m128[0];
    fVar55 = patch->patch_v[3][3].field_0.m128[0];
    fVar56 = patch->patch_v[0][0].field_0.m128[1];
    fVar76 = patch->patch_v[1][0].field_0.m128[1];
    fVar18 = patch->patch_v[2][0].field_0.m128[1];
    fVar105 = (fVar21 * fVar41 + fVar28 * fVar69 + fVar31 * fVar88 + fVar34 * fVar126) * fVar19 +
              (fVar38 * fVar41 + fVar42 * fVar69 + fVar46 * fVar88 + fVar91 * fVar126) * fVar29 +
              (fVar93 * fVar41 + fVar95 * fVar69 + fVar97 * fVar88 + fVar99 * fVar126) * fVar35 +
              (fVar43 * fVar41 + fVar137 * fVar69 + fVar53 * fVar88 + fVar55 * fVar126) * fVar37;
    fVar132 = (fVar21 * fVar57 + fVar28 * fVar70 + fVar31 * fVar90 + fVar34 * fVar101) * fVar25 +
              (fVar38 * fVar57 + fVar42 * fVar70 + fVar46 * fVar90 + fVar91 * fVar101) * fVar30 +
              (fVar93 * fVar57 + fVar95 * fVar70 + fVar97 * fVar90 + fVar99 * fVar101) * fVar36 +
              (fVar43 * fVar57 + fVar137 * fVar70 + fVar53 * fVar90 + fVar55 * fVar101) * fVar86;
    fVar106 = (fVar21 * fVar58 + fVar28 * fVar71 + fVar31 * fVar92 + fVar34 * fVar127) * fVar81 +
              (fVar38 * fVar58 + fVar42 * fVar71 + fVar46 * fVar92 + fVar91 * fVar127) * fVar54 +
              (fVar93 * fVar58 + fVar95 * fVar71 + fVar97 * fVar92 + fVar99 * fVar127) * fVar64 +
              (fVar43 * fVar58 + fVar137 * fVar71 + fVar53 * fVar92 + fVar55 * fVar127) * fVar44;
    fVar134 = (fVar21 * fVar59 + fVar28 * fVar72 + fVar31 * fVar94 + fVar34 * fVar103) * fVar26 +
              (fVar38 * fVar59 + fVar42 * fVar72 + fVar46 * fVar94 + fVar91 * fVar103) * fVar83 +
              (fVar93 * fVar59 + fVar95 * fVar72 + fVar97 * fVar94 + fVar99 * fVar103) * fVar20 +
              (fVar43 * fVar59 + fVar137 * fVar72 + fVar53 * fVar94 + fVar55 * fVar103) * fVar45;
    fVar107 = (fVar21 * fVar61 + fVar28 * fVar73 + fVar31 * fVar96 + fVar34 * fVar128) * fVar27 +
              (fVar38 * fVar61 + fVar42 * fVar73 + fVar46 * fVar96 + fVar91 * fVar128) * fVar32 +
              (fVar93 * fVar61 + fVar95 * fVar73 + fVar97 * fVar96 + fVar99 * fVar128) * fVar85 +
              (fVar43 * fVar61 + fVar137 * fVar73 + fVar53 * fVar96 + fVar55 * fVar128) * fVar62;
    fVar136 = (fVar21 * fVar65 + fVar28 * fVar74 + fVar31 * fVar98 + fVar34 * fVar104) * fVar39 +
              (fVar38 * fVar65 + fVar42 * fVar74 + fVar46 * fVar98 + fVar91 * fVar104) * fVar33 +
              (fVar93 * fVar65 + fVar95 * fVar74 + fVar97 * fVar98 + fVar99 * fVar104) * fVar40 +
              (fVar43 * fVar65 + fVar137 * fVar74 + fVar53 * fVar98 + fVar55 * fVar104) * fVar47;
    fVar108 = (fVar21 * fVar66 + fVar28 * fVar87 + fVar31 * fVar100 + fVar34 * fVar130) * fVar82 +
              (fVar38 * fVar66 + fVar42 * fVar87 + fVar46 * fVar100 + fVar91 * fVar130) * fVar84 +
              (fVar93 * fVar66 + fVar95 * fVar87 + fVar97 * fVar100 + fVar99 * fVar130) * fVar60 +
              (fVar43 * fVar66 + fVar137 * fVar87 + fVar53 * fVar100 + fVar55 * fVar130) * fVar75;
    fVar109 = fVar21 + fVar28 + fVar31 + fVar34 +
              fVar38 + fVar42 + fVar46 + fVar91 +
              fVar93 + fVar109 + fVar43 + fVar137 + fVar53 + fVar109;
    fVar21 = patch->patch_v[3][0].field_0.m128[1];
    fVar28 = patch->patch_v[0][1].field_0.m128[1];
    fVar31 = patch->patch_v[1][1].field_0.m128[1];
    fVar34 = patch->patch_v[2][1].field_0.m128[1];
    fVar38 = patch->patch_v[3][1].field_0.m128[1];
    fVar137 = fVar31 + fVar34 + fVar38;
    fVar42 = patch->patch_v[0][2].field_0.m128[1];
    fVar46 = patch->patch_v[1][2].field_0.m128[1];
    fVar91 = patch->patch_v[2][2].field_0.m128[1];
    fVar93 = patch->patch_v[3][2].field_0.m128[1];
    fVar95 = patch->patch_v[0][3].field_0.m128[1];
    fVar97 = patch->patch_v[1][3].field_0.m128[1];
    fVar99 = patch->patch_v[2][3].field_0.m128[1];
    fVar43 = patch->patch_v[3][3].field_0.m128[1];
    fVar110 = (fVar56 * fVar41 + fVar76 * fVar69 + fVar18 * fVar88 + fVar21 * fVar126) * fVar19 +
              (fVar28 * fVar41 + fVar31 * fVar69 + fVar34 * fVar88 + fVar38 * fVar126) * fVar29 +
              (fVar42 * fVar41 + fVar46 * fVar69 + fVar91 * fVar88 + fVar93 * fVar126) * fVar35 +
              (fVar95 * fVar41 + fVar97 * fVar69 + fVar99 * fVar88 + fVar43 * fVar126) * fVar37;
    fVar111 = (fVar56 * fVar57 + fVar76 * fVar70 + fVar18 * fVar90 + fVar21 * fVar101) * fVar25 +
              (fVar28 * fVar57 + fVar31 * fVar70 + fVar34 * fVar90 + fVar38 * fVar101) * fVar30 +
              (fVar42 * fVar57 + fVar46 * fVar70 + fVar91 * fVar90 + fVar93 * fVar101) * fVar36 +
              (fVar95 * fVar57 + fVar97 * fVar70 + fVar99 * fVar90 + fVar43 * fVar101) * fVar86;
    fVar112 = (fVar56 * fVar58 + fVar76 * fVar71 + fVar18 * fVar92 + fVar21 * fVar127) * fVar81 +
              (fVar28 * fVar58 + fVar31 * fVar71 + fVar34 * fVar92 + fVar38 * fVar127) * fVar54 +
              (fVar42 * fVar58 + fVar46 * fVar71 + fVar91 * fVar92 + fVar93 * fVar127) * fVar64 +
              (fVar95 * fVar58 + fVar97 * fVar71 + fVar99 * fVar92 + fVar43 * fVar127) * fVar44;
    fVar113 = (fVar56 * fVar59 + fVar76 * fVar72 + fVar18 * fVar94 + fVar21 * fVar103) * fVar26 +
              (fVar28 * fVar59 + fVar31 * fVar72 + fVar34 * fVar94 + fVar38 * fVar103) * fVar83 +
              (fVar42 * fVar59 + fVar46 * fVar72 + fVar91 * fVar94 + fVar93 * fVar103) * fVar20 +
              (fVar95 * fVar59 + fVar97 * fVar72 + fVar99 * fVar94 + fVar43 * fVar103) * fVar45;
    fVar114 = (fVar56 * fVar61 + fVar76 * fVar73 + fVar18 * fVar96 + fVar21 * fVar128) * fVar27 +
              (fVar28 * fVar61 + fVar31 * fVar73 + fVar34 * fVar96 + fVar38 * fVar128) * fVar32 +
              (fVar42 * fVar61 + fVar46 * fVar73 + fVar91 * fVar96 + fVar93 * fVar128) * fVar85 +
              (fVar95 * fVar61 + fVar97 * fVar73 + fVar99 * fVar96 + fVar43 * fVar128) * fVar62;
    fVar115 = (fVar56 * fVar65 + fVar76 * fVar74 + fVar18 * fVar98 + fVar21 * fVar104) * fVar39 +
              (fVar28 * fVar65 + fVar31 * fVar74 + fVar34 * fVar98 + fVar38 * fVar104) * fVar33 +
              (fVar42 * fVar65 + fVar46 * fVar74 + fVar91 * fVar98 + fVar93 * fVar104) * fVar40 +
              (fVar95 * fVar65 + fVar97 * fVar74 + fVar99 * fVar98 + fVar43 * fVar104) * fVar47;
    fVar116 = (fVar56 * fVar66 + fVar76 * fVar87 + fVar18 * fVar100 + fVar21 * fVar130) * fVar82 +
              (fVar28 * fVar66 + fVar31 * fVar87 + fVar34 * fVar100 + fVar38 * fVar130) * fVar84 +
              (fVar42 * fVar66 + fVar46 * fVar87 + fVar91 * fVar100 + fVar93 * fVar130) * fVar60 +
              (fVar95 * fVar66 + fVar97 * fVar87 + fVar99 * fVar100 + fVar43 * fVar130) * fVar75;
    fVar117 = fVar56 + fVar76 + fVar18 + fVar21 +
              fVar28 + fVar137 +
              fVar42 + fVar46 + fVar91 + fVar137 + fVar95 + fVar97 + fVar99 + fVar43;
    fVar21 = patch->patch_v[0][0].field_0.m128[2];
    fVar28 = patch->patch_v[1][0].field_0.m128[2];
    fVar31 = patch->patch_v[2][0].field_0.m128[2];
    fVar34 = patch->patch_v[3][0].field_0.m128[2];
    fVar46 = patch->patch_v[0][1].field_0.m128[2];
    fVar91 = patch->patch_v[1][1].field_0.m128[2];
    fVar93 = patch->patch_v[2][1].field_0.m128[2];
    fVar95 = patch->patch_v[3][1].field_0.m128[2];
    auVar119._0_4_ = fVar21 * fVar41 + fVar28 * fVar69 + fVar31 * fVar88 + fVar34 * fVar126;
    auVar119._4_4_ = fVar21 * fVar57 + fVar28 * fVar70 + fVar31 * fVar90 + fVar34 * fVar101;
    auVar119._8_4_ = fVar21 * fVar58 + fVar28 * fVar71 + fVar31 * fVar92 + fVar34 * fVar127;
    auVar119._12_4_ = fVar21 * fVar59 + fVar28 * fVar72 + fVar31 * fVar94 + fVar34 * fVar103;
    auVar119._16_4_ = fVar21 * fVar61 + fVar28 * fVar73 + fVar31 * fVar96 + fVar34 * fVar128;
    auVar119._20_4_ = fVar21 * fVar65 + fVar28 * fVar74 + fVar31 * fVar98 + fVar34 * fVar104;
    auVar119._24_4_ = fVar21 * fVar66 + fVar28 * fVar87 + fVar31 * fVar100 + fVar34 * fVar130;
    fVar97 = patch->patch_v[0][2].field_0.m128[2];
    fVar99 = patch->patch_v[2][2].field_0.m128[2];
    fVar43 = patch->patch_v[3][2].field_0.m128[2];
    fVar137 = patch->patch_v[1][2].field_0.m128[2];
    fVar53 = patch->patch_v[3][3].field_0.m128[2];
    fVar55 = patch->patch_v[2][3].field_0.m128[2];
    fVar56 = patch->patch_v[1][3].field_0.m128[2];
    fVar76 = patch->patch_v[0][3].field_0.m128[2];
    fVar21 = (fVar46 * fVar41 + fVar91 * fVar69 + fVar93 * fVar88 + fVar95 * fVar126) * fVar29 +
             (fVar97 * fVar41 + fVar137 * fVar69 + fVar99 * fVar88 + fVar43 * fVar126) * fVar35 +
             fVar37 * (fVar41 * fVar76 + fVar69 * fVar56 + fVar55 * fVar88 + fVar53 * fVar126);
    fVar28 = (fVar46 * fVar57 + fVar91 * fVar70 + fVar93 * fVar90 + fVar95 * fVar101) * fVar30 +
             (fVar97 * fVar57 + fVar137 * fVar70 + fVar99 * fVar90 + fVar43 * fVar101) * fVar36 +
             fVar86 * (fVar57 * fVar76 + fVar70 * fVar56 + fVar55 * fVar90 + fVar53 * fVar101);
    fVar31 = (fVar46 * fVar58 + fVar91 * fVar71 + fVar93 * fVar92 + fVar95 * fVar127) * fVar54 +
             (fVar97 * fVar58 + fVar137 * fVar71 + fVar99 * fVar92 + fVar43 * fVar127) * fVar64 +
             fVar44 * (fVar58 * fVar76 + fVar71 * fVar56 + fVar55 * fVar92 + fVar53 * fVar127);
    fVar34 = (fVar46 * fVar59 + fVar91 * fVar72 + fVar93 * fVar94 + fVar95 * fVar103) * fVar83 +
             (fVar97 * fVar59 + fVar137 * fVar72 + fVar99 * fVar94 + fVar43 * fVar103) * fVar20 +
             fVar45 * (fVar59 * fVar76 + fVar72 * fVar56 + fVar55 * fVar94 + fVar53 * fVar103);
    fVar38 = (fVar46 * fVar61 + fVar91 * fVar73 + fVar93 * fVar96 + fVar95 * fVar128) * fVar32 +
             (fVar97 * fVar61 + fVar137 * fVar73 + fVar99 * fVar96 + fVar43 * fVar128) * fVar85 +
             fVar62 * (fVar61 * fVar76 + fVar73 * fVar56 + fVar55 * fVar96 + fVar53 * fVar128);
    fVar42 = (fVar46 * fVar65 + fVar91 * fVar74 + fVar93 * fVar98 + fVar95 * fVar104) * fVar33 +
             (fVar97 * fVar65 + fVar137 * fVar74 + fVar99 * fVar98 + fVar43 * fVar104) * fVar40 +
             fVar47 * (fVar65 * fVar76 + fVar74 * fVar56 + fVar55 * fVar98 + fVar53 * fVar104);
    fVar46 = (fVar46 * fVar66 + fVar91 * fVar87 + fVar93 * fVar100 + fVar95 * fVar130) * fVar84 +
             (fVar97 * fVar66 + fVar137 * fVar87 + fVar99 * fVar100 + fVar43 * fVar130) * fVar60 +
             fVar75 * (fVar66 * fVar76 + fVar87 * fVar56 + fVar55 * fVar100 + fVar53 * fVar130);
    fVar91 = auVar79._28_4_ +
             in_register_0000129c +
             in_register_0000145c + in_register_0000149c +
             in_register_0000141c + in_register_000012dc;
    break;
  case '\x02':
    auVar23._8_4_ = 0x3f800000;
    auVar23._0_8_ = 0x3f8000003f800000;
    auVar23._12_4_ = 0x3f800000;
    auVar23._16_4_ = 0x3f800000;
    auVar23._20_4_ = 0x3f800000;
    auVar23._24_4_ = 0x3f800000;
    auVar23._28_4_ = 0x3f800000;
    auVar52 = *(undefined1 (*) [32])(uu->field_0).v;
    auVar24 = vsubps_avx(auVar23,auVar52);
    auVar79 = *(undefined1 (*) [32])(vv->field_0).v;
    auVar63 = vsubps_avx(auVar23,auVar79);
    fVar21 = auVar24._0_4_;
    fVar31 = auVar24._4_4_;
    fVar38 = auVar24._8_4_;
    fVar46 = auVar24._12_4_;
    fVar93 = auVar24._16_4_;
    fVar97 = auVar24._20_4_;
    fVar43 = auVar24._24_4_;
    fVar29 = fVar21 * fVar21 * fVar21;
    fVar30 = fVar31 * fVar31 * fVar31;
    fVar54 = fVar38 * fVar38 * fVar38;
    fVar83 = fVar46 * fVar46 * fVar46;
    fVar32 = fVar93 * fVar93 * fVar93;
    fVar33 = fVar97 * fVar97 * fVar97;
    fVar60 = fVar43 * fVar43 * fVar43;
    fVar28 = auVar63._0_4_;
    fVar34 = auVar63._4_4_;
    fVar42 = auVar63._8_4_;
    fVar91 = auVar63._12_4_;
    fVar95 = auVar63._16_4_;
    fVar99 = auVar63._20_4_;
    fVar137 = auVar63._24_4_;
    fVar19 = fVar28 * fVar28 * fVar28;
    fVar25 = fVar34 * fVar34 * fVar34;
    fVar81 = fVar42 * fVar42 * fVar42;
    fVar26 = fVar91 * fVar91 * fVar91;
    fVar27 = fVar95 * fVar95 * fVar95;
    fVar39 = fVar99 * fVar99 * fVar99;
    fVar82 = fVar137 * fVar137 * fVar137;
    fVar48 = 1.0;
    fVar69 = auVar52._0_4_;
    fVar71 = auVar52._4_4_;
    fVar73 = auVar52._8_4_;
    fVar87 = auVar52._12_4_;
    fVar90 = auVar52._16_4_;
    fVar94 = auVar52._20_4_;
    fVar98 = auVar52._24_4_;
    fVar41 = fVar21 * fVar69 * fVar21 * 3.0;
    fVar37 = fVar31 * fVar71 * fVar31 * 3.0;
    fVar86 = fVar38 * fVar73 * fVar38 * 3.0;
    fVar44 = fVar46 * fVar87 * fVar46 * 3.0;
    fVar45 = fVar93 * fVar90 * fVar93 * 3.0;
    fVar62 = fVar97 * fVar94 * fVar97 * 3.0;
    fVar47 = fVar43 * fVar98 * fVar43 * 3.0;
    fVar70 = auVar79._0_4_;
    fVar72 = auVar79._4_4_;
    fVar74 = auVar79._8_4_;
    fVar88 = auVar79._12_4_;
    fVar92 = auVar79._16_4_;
    fVar96 = auVar79._20_4_;
    fVar100 = auVar79._24_4_;
    fVar84 = fVar70 * fVar28 * fVar28 * 3.0;
    fVar35 = fVar72 * fVar34 * fVar34 * 3.0;
    fVar36 = fVar74 * fVar42 * fVar42 * 3.0;
    fVar64 = fVar88 * fVar91 * fVar91 * 3.0;
    fVar20 = fVar92 * fVar95 * fVar95 * 3.0;
    fVar85 = fVar96 * fVar99 * fVar99 * 3.0;
    fVar40 = fVar100 * fVar137 * fVar137 * 3.0;
    fVar126 = fVar69 * fVar69 * fVar21 * 3.0;
    fVar101 = fVar71 * fVar71 * fVar31 * 3.0;
    fVar127 = fVar73 * fVar73 * fVar38 * 3.0;
    fVar103 = fVar87 * fVar87 * fVar46 * 3.0;
    fVar128 = fVar90 * fVar90 * fVar93 * 3.0;
    fVar104 = fVar94 * fVar94 * fVar97 * 3.0;
    fVar130 = fVar98 * fVar98 * fVar43 * 3.0;
    fVar75 = fVar70 * fVar70 * fVar28 * 3.0;
    fVar57 = fVar72 * fVar72 * fVar34 * 3.0;
    fVar58 = fVar74 * fVar74 * fVar42 * 3.0;
    fVar59 = fVar88 * fVar88 * fVar91 * 3.0;
    fVar61 = fVar92 * fVar92 * fVar95 * 3.0;
    fVar65 = fVar96 * fVar96 * fVar99 * 3.0;
    fVar66 = fVar100 * fVar100 * fVar137 * 3.0;
    fVar69 = fVar69 * fVar69 * fVar69;
    fVar71 = fVar71 * fVar71 * fVar71;
    fVar73 = fVar73 * fVar73 * fVar73;
    fVar87 = fVar87 * fVar87 * fVar87;
    fVar90 = fVar90 * fVar90 * fVar90;
    fVar94 = fVar94 * fVar94 * fVar94;
    fVar98 = fVar98 * fVar98 * fVar98;
    fVar70 = fVar70 * fVar70 * fVar70;
    fVar72 = fVar72 * fVar72 * fVar72;
    fVar74 = fVar74 * fVar74 * fVar74;
    fVar88 = fVar88 * fVar88 * fVar88;
    fVar92 = fVar92 * fVar92 * fVar92;
    fVar96 = fVar96 * fVar96 * fVar96;
    fVar100 = fVar100 * fVar100 * fVar100;
    fVar21 = patch->patch_v[0][0].field_0.m128[0];
    fVar28 = patch->patch_v[0][1].field_0.m128[0];
    fVar31 = patch->patch_v[0][2].field_0.m128[0];
    fVar34 = patch->patch_v[0][3].field_0.m128[0];
    fVar38 = patch->patch_v[1][0].field_0.m128[0];
    fVar42 = patch->patch_v[1][1].field_0.m128[0];
    fVar46 = patch->patch_v[1][2].field_0.m128[0];
    fVar91 = patch->patch_v[1][3].field_0.m128[0];
    fVar93 = patch->patch_v[2][0].field_0.m128[0];
    fVar95 = patch->patch_v[2][1].field_0.m128[0];
    fVar97 = patch->patch_v[2][2].field_0.m128[0];
    fVar99 = patch->patch_v[2][3].field_0.m128[0];
    fVar109 = fVar95 + fVar97 + fVar99;
    fVar43 = patch->patch_v[3][0].field_0.m128[0];
    fVar137 = patch->patch_v[3][1].field_0.m128[0];
    fVar53 = patch->patch_v[3][2].field_0.m128[0];
    fVar55 = patch->patch_v[3][3].field_0.m128[0];
    fVar56 = patch->patch_v[0][0].field_0.m128[1];
    fVar76 = patch->patch_v[0][1].field_0.m128[1];
    fVar18 = patch->patch_v[0][2].field_0.m128[1];
    fVar105 = (fVar21 * fVar29 + fVar28 * fVar41 + fVar31 * fVar126 + fVar34 * fVar69) * fVar19 +
              (fVar38 * fVar29 + fVar42 * fVar41 + fVar46 * fVar126 + fVar91 * fVar69) * fVar84 +
              (fVar93 * fVar29 + fVar95 * fVar41 + fVar97 * fVar126 + fVar99 * fVar69) * fVar75 +
              (fVar43 * fVar29 + fVar137 * fVar41 + fVar53 * fVar126 + fVar55 * fVar69) * fVar70;
    fVar132 = (fVar21 * fVar30 + fVar28 * fVar37 + fVar31 * fVar101 + fVar34 * fVar71) * fVar25 +
              (fVar38 * fVar30 + fVar42 * fVar37 + fVar46 * fVar101 + fVar91 * fVar71) * fVar35 +
              (fVar93 * fVar30 + fVar95 * fVar37 + fVar97 * fVar101 + fVar99 * fVar71) * fVar57 +
              (fVar43 * fVar30 + fVar137 * fVar37 + fVar53 * fVar101 + fVar55 * fVar71) * fVar72;
    fVar106 = (fVar21 * fVar54 + fVar28 * fVar86 + fVar31 * fVar127 + fVar34 * fVar73) * fVar81 +
              (fVar38 * fVar54 + fVar42 * fVar86 + fVar46 * fVar127 + fVar91 * fVar73) * fVar36 +
              (fVar93 * fVar54 + fVar95 * fVar86 + fVar97 * fVar127 + fVar99 * fVar73) * fVar58 +
              (fVar43 * fVar54 + fVar137 * fVar86 + fVar53 * fVar127 + fVar55 * fVar73) * fVar74;
    fVar134 = (fVar21 * fVar83 + fVar28 * fVar44 + fVar31 * fVar103 + fVar34 * fVar87) * fVar26 +
              (fVar38 * fVar83 + fVar42 * fVar44 + fVar46 * fVar103 + fVar91 * fVar87) * fVar64 +
              (fVar93 * fVar83 + fVar95 * fVar44 + fVar97 * fVar103 + fVar99 * fVar87) * fVar59 +
              (fVar43 * fVar83 + fVar137 * fVar44 + fVar53 * fVar103 + fVar55 * fVar87) * fVar88;
    fVar107 = (fVar21 * fVar32 + fVar28 * fVar45 + fVar31 * fVar128 + fVar34 * fVar90) * fVar27 +
              (fVar38 * fVar32 + fVar42 * fVar45 + fVar46 * fVar128 + fVar91 * fVar90) * fVar20 +
              (fVar93 * fVar32 + fVar95 * fVar45 + fVar97 * fVar128 + fVar99 * fVar90) * fVar61 +
              (fVar43 * fVar32 + fVar137 * fVar45 + fVar53 * fVar128 + fVar55 * fVar90) * fVar92;
    fVar136 = (fVar21 * fVar33 + fVar28 * fVar62 + fVar31 * fVar104 + fVar34 * fVar94) * fVar39 +
              (fVar38 * fVar33 + fVar42 * fVar62 + fVar46 * fVar104 + fVar91 * fVar94) * fVar85 +
              (fVar93 * fVar33 + fVar95 * fVar62 + fVar97 * fVar104 + fVar99 * fVar94) * fVar65 +
              (fVar43 * fVar33 + fVar137 * fVar62 + fVar53 * fVar104 + fVar55 * fVar94) * fVar96;
    fVar108 = (fVar21 * fVar60 + fVar28 * fVar47 + fVar31 * fVar130 + fVar34 * fVar98) * fVar82 +
              (fVar38 * fVar60 + fVar42 * fVar47 + fVar46 * fVar130 + fVar91 * fVar98) * fVar40 +
              (fVar93 * fVar60 + fVar95 * fVar47 + fVar97 * fVar130 + fVar99 * fVar98) * fVar66 +
              (fVar43 * fVar60 + fVar137 * fVar47 + fVar53 * fVar130 + fVar55 * fVar98) * fVar100;
    fVar109 = fVar21 + fVar28 + fVar31 + fVar34 +
              fVar38 + fVar42 + fVar46 + fVar91 +
              fVar93 + fVar109 + fVar43 + fVar137 + fVar53 + fVar109;
    fVar21 = patch->patch_v[0][3].field_0.m128[1];
    fVar28 = patch->patch_v[1][0].field_0.m128[1];
    fVar31 = patch->patch_v[1][1].field_0.m128[1];
    fVar34 = patch->patch_v[1][2].field_0.m128[1];
    fVar38 = patch->patch_v[1][3].field_0.m128[1];
    fVar137 = fVar31 + fVar34 + fVar38;
    fVar42 = patch->patch_v[2][0].field_0.m128[1];
    fVar46 = patch->patch_v[2][1].field_0.m128[1];
    fVar91 = patch->patch_v[2][2].field_0.m128[1];
    fVar93 = patch->patch_v[2][3].field_0.m128[1];
    fVar95 = patch->patch_v[3][0].field_0.m128[1];
    fVar97 = patch->patch_v[3][1].field_0.m128[1];
    fVar99 = patch->patch_v[3][2].field_0.m128[1];
    fVar43 = patch->patch_v[3][3].field_0.m128[1];
    fVar110 = (fVar56 * fVar29 + fVar76 * fVar41 + fVar18 * fVar126 + fVar21 * fVar69) * fVar19 +
              (fVar28 * fVar29 + fVar31 * fVar41 + fVar34 * fVar126 + fVar38 * fVar69) * fVar84 +
              (fVar42 * fVar29 + fVar46 * fVar41 + fVar91 * fVar126 + fVar93 * fVar69) * fVar75 +
              (fVar95 * fVar29 + fVar97 * fVar41 + fVar99 * fVar126 + fVar43 * fVar69) * fVar70;
    fVar111 = (fVar56 * fVar30 + fVar76 * fVar37 + fVar18 * fVar101 + fVar21 * fVar71) * fVar25 +
              (fVar28 * fVar30 + fVar31 * fVar37 + fVar34 * fVar101 + fVar38 * fVar71) * fVar35 +
              (fVar42 * fVar30 + fVar46 * fVar37 + fVar91 * fVar101 + fVar93 * fVar71) * fVar57 +
              (fVar95 * fVar30 + fVar97 * fVar37 + fVar99 * fVar101 + fVar43 * fVar71) * fVar72;
    fVar112 = (fVar56 * fVar54 + fVar76 * fVar86 + fVar18 * fVar127 + fVar21 * fVar73) * fVar81 +
              (fVar28 * fVar54 + fVar31 * fVar86 + fVar34 * fVar127 + fVar38 * fVar73) * fVar36 +
              (fVar42 * fVar54 + fVar46 * fVar86 + fVar91 * fVar127 + fVar93 * fVar73) * fVar58 +
              (fVar95 * fVar54 + fVar97 * fVar86 + fVar99 * fVar127 + fVar43 * fVar73) * fVar74;
    fVar113 = (fVar56 * fVar83 + fVar76 * fVar44 + fVar18 * fVar103 + fVar21 * fVar87) * fVar26 +
              (fVar28 * fVar83 + fVar31 * fVar44 + fVar34 * fVar103 + fVar38 * fVar87) * fVar64 +
              (fVar42 * fVar83 + fVar46 * fVar44 + fVar91 * fVar103 + fVar93 * fVar87) * fVar59 +
              (fVar95 * fVar83 + fVar97 * fVar44 + fVar99 * fVar103 + fVar43 * fVar87) * fVar88;
    fVar114 = (fVar56 * fVar32 + fVar76 * fVar45 + fVar18 * fVar128 + fVar21 * fVar90) * fVar27 +
              (fVar28 * fVar32 + fVar31 * fVar45 + fVar34 * fVar128 + fVar38 * fVar90) * fVar20 +
              (fVar42 * fVar32 + fVar46 * fVar45 + fVar91 * fVar128 + fVar93 * fVar90) * fVar61 +
              (fVar95 * fVar32 + fVar97 * fVar45 + fVar99 * fVar128 + fVar43 * fVar90) * fVar92;
    fVar115 = (fVar56 * fVar33 + fVar76 * fVar62 + fVar18 * fVar104 + fVar21 * fVar94) * fVar39 +
              (fVar28 * fVar33 + fVar31 * fVar62 + fVar34 * fVar104 + fVar38 * fVar94) * fVar85 +
              (fVar42 * fVar33 + fVar46 * fVar62 + fVar91 * fVar104 + fVar93 * fVar94) * fVar65 +
              (fVar95 * fVar33 + fVar97 * fVar62 + fVar99 * fVar104 + fVar43 * fVar94) * fVar96;
    fVar116 = (fVar56 * fVar60 + fVar76 * fVar47 + fVar18 * fVar130 + fVar21 * fVar98) * fVar82 +
              (fVar28 * fVar60 + fVar31 * fVar47 + fVar34 * fVar130 + fVar38 * fVar98) * fVar40 +
              (fVar42 * fVar60 + fVar46 * fVar47 + fVar91 * fVar130 + fVar93 * fVar98) * fVar66 +
              (fVar95 * fVar60 + fVar97 * fVar47 + fVar99 * fVar130 + fVar43 * fVar98) * fVar100;
    fVar117 = fVar56 + fVar76 + fVar18 + fVar21 +
              fVar28 + fVar137 +
              fVar42 + fVar46 + fVar91 + fVar137 + fVar95 + fVar97 + fVar99 + fVar43;
    fVar21 = patch->patch_v[0][0].field_0.m128[2];
    fVar28 = patch->patch_v[0][1].field_0.m128[2];
    fVar31 = patch->patch_v[0][2].field_0.m128[2];
    fVar34 = patch->patch_v[0][3].field_0.m128[2];
    fVar46 = patch->patch_v[1][0].field_0.m128[2];
    fVar91 = patch->patch_v[1][1].field_0.m128[2];
    fVar93 = patch->patch_v[1][2].field_0.m128[2];
    fVar95 = patch->patch_v[1][3].field_0.m128[2];
    auVar119._0_4_ = fVar21 * fVar29 + fVar28 * fVar41 + fVar31 * fVar126 + fVar34 * fVar69;
    auVar119._4_4_ = fVar21 * fVar30 + fVar28 * fVar37 + fVar31 * fVar101 + fVar34 * fVar71;
    auVar119._8_4_ = fVar21 * fVar54 + fVar28 * fVar86 + fVar31 * fVar127 + fVar34 * fVar73;
    auVar119._12_4_ = fVar21 * fVar83 + fVar28 * fVar44 + fVar31 * fVar103 + fVar34 * fVar87;
    auVar119._16_4_ = fVar21 * fVar32 + fVar28 * fVar45 + fVar31 * fVar128 + fVar34 * fVar90;
    auVar119._20_4_ = fVar21 * fVar33 + fVar28 * fVar62 + fVar31 * fVar104 + fVar34 * fVar94;
    auVar119._24_4_ = fVar21 * fVar60 + fVar28 * fVar47 + fVar31 * fVar130 + fVar34 * fVar98;
    fVar97 = patch->patch_v[2][0].field_0.m128[2];
    fVar99 = patch->patch_v[2][2].field_0.m128[2];
    fVar43 = patch->patch_v[2][3].field_0.m128[2];
    fVar137 = patch->patch_v[2][1].field_0.m128[2];
    fVar53 = patch->patch_v[3][3].field_0.m128[2];
    fVar55 = patch->patch_v[3][2].field_0.m128[2];
    fVar56 = patch->patch_v[3][1].field_0.m128[2];
    fVar18 = in_register_000012dc + in_register_0000139c + 3.0;
    fVar76 = patch->patch_v[3][0].field_0.m128[2];
    fVar21 = (fVar46 * fVar29 + fVar91 * fVar41 + fVar93 * fVar126 + fVar95 * fVar69) * fVar84 +
             (fVar97 * fVar29 + fVar137 * fVar41 + fVar99 * fVar126 + fVar43 * fVar69) * fVar75 +
             fVar70 * (fVar29 * fVar76 + fVar41 * fVar56 + fVar55 * fVar126 + fVar53 * fVar69);
    fVar28 = (fVar46 * fVar30 + fVar91 * fVar37 + fVar93 * fVar101 + fVar95 * fVar71) * fVar35 +
             (fVar97 * fVar30 + fVar137 * fVar37 + fVar99 * fVar101 + fVar43 * fVar71) * fVar57 +
             fVar72 * (fVar30 * fVar76 + fVar37 * fVar56 + fVar55 * fVar101 + fVar53 * fVar71);
    fVar31 = (fVar46 * fVar54 + fVar91 * fVar86 + fVar93 * fVar127 + fVar95 * fVar73) * fVar36 +
             (fVar97 * fVar54 + fVar137 * fVar86 + fVar99 * fVar127 + fVar43 * fVar73) * fVar58 +
             fVar74 * (fVar54 * fVar76 + fVar86 * fVar56 + fVar55 * fVar127 + fVar53 * fVar73);
    fVar34 = (fVar46 * fVar83 + fVar91 * fVar44 + fVar93 * fVar103 + fVar95 * fVar87) * fVar64 +
             (fVar97 * fVar83 + fVar137 * fVar44 + fVar99 * fVar103 + fVar43 * fVar87) * fVar59 +
             fVar88 * (fVar83 * fVar76 + fVar44 * fVar56 + fVar55 * fVar103 + fVar53 * fVar87);
    fVar38 = (fVar46 * fVar32 + fVar91 * fVar45 + fVar93 * fVar128 + fVar95 * fVar90) * fVar20 +
             (fVar97 * fVar32 + fVar137 * fVar45 + fVar99 * fVar128 + fVar43 * fVar90) * fVar61 +
             fVar92 * (fVar32 * fVar76 + fVar45 * fVar56 + fVar55 * fVar128 + fVar53 * fVar90);
    fVar42 = (fVar46 * fVar33 + fVar91 * fVar62 + fVar93 * fVar104 + fVar95 * fVar94) * fVar85 +
             (fVar97 * fVar33 + fVar137 * fVar62 + fVar99 * fVar104 + fVar43 * fVar94) * fVar65 +
             fVar96 * (fVar33 * fVar76 + fVar62 * fVar56 + fVar55 * fVar104 + fVar53 * fVar94);
    fVar46 = (fVar46 * fVar60 + fVar91 * fVar47 + fVar93 * fVar130 + fVar95 * fVar98) * fVar40 +
             (fVar97 * fVar60 + fVar137 * fVar47 + fVar99 * fVar130 + fVar43 * fVar98) * fVar66 +
             fVar100 * (fVar60 * fVar76 + fVar47 * fVar56 + fVar55 * fVar130 + fVar53 * fVar98);
    fVar91 = auVar24._28_4_ + fVar18 + in_register_0000125c + fVar18;
    break;
  case '\x03':
    fVar48 = patch->patch_v[0][0].field_0.m128[3];
    fVar21 = patch->patch_v[0][1].field_0.m128[3];
    fVar28 = patch->patch_v[0][2].field_0.m128[3];
    fVar31 = patch->patch_v[1][0].field_0.m128[3];
    fVar34 = patch->patch_v[1][1].field_0.m128[3];
    auVar52 = *(undefined1 (*) [32])(uu->field_0).v;
    auVar49._8_4_ = 0x3f800000;
    auVar49._0_8_ = 0x3f8000003f800000;
    auVar49._12_4_ = 0x3f800000;
    auVar49._16_4_ = 0x3f800000;
    auVar49._20_4_ = 0x3f800000;
    auVar49._24_4_ = 0x3f800000;
    auVar49._28_4_ = 0x3f800000;
    auVar79 = vcmpps_avx(auVar52,ZEXT832(0),0);
    auVar24 = vcmpps_avx(auVar52,auVar49,0);
    auVar68 = vorps_avx(auVar24,auVar79);
    auVar79 = *(undefined1 (*) [32])(vv->field_0).v;
    auVar24 = vcmpps_avx(auVar79,ZEXT832(0),0);
    auVar63 = vcmpps_avx(auVar79,auVar49,0);
    auVar24 = vorps_avx(auVar63,auVar24);
    auVar23 = vorps_avx(auVar68,auVar24);
    local_148._4_4_ = patch->patch_v[1][1].field_0.m128[0];
    local_148._0_4_ = local_148._4_4_;
    fStack_140 = (float)local_148._4_4_;
    fStack_13c = (float)local_148._4_4_;
    fStack_138 = (float)local_148._4_4_;
    fStack_134 = (float)local_148._4_4_;
    fStack_130 = (float)local_148._4_4_;
    fStack_12c = (float)local_148._4_4_;
    local_168._4_4_ = patch->patch_v[1][1].field_0.m128[1];
    local_168._0_4_ = local_168._4_4_;
    fStack_160 = (float)local_168._4_4_;
    fStack_15c = (float)local_168._4_4_;
    fStack_158 = (float)local_168._4_4_;
    fStack_154 = (float)local_168._4_4_;
    fStack_150 = (float)local_168._4_4_;
    fStack_14c = (float)local_168._4_4_;
    local_188._4_4_ = patch->patch_v[1][1].field_0.m128[2];
    local_188._0_4_ = local_188._4_4_;
    fStack_180 = (float)local_188._4_4_;
    fStack_17c = (float)local_188._4_4_;
    fStack_178 = (float)local_188._4_4_;
    fStack_174 = (float)local_188._4_4_;
    fStack_170 = (float)local_188._4_4_;
    fStack_16c = (float)local_188._4_4_;
    local_208._4_4_ = patch->patch_v[1][2].field_0.m128[0];
    local_208._0_4_ = local_208._4_4_;
    fStack_200 = (float)local_208._4_4_;
    fStack_1fc = (float)local_208._4_4_;
    fStack_1f8 = (float)local_208._4_4_;
    fStack_1f4 = (float)local_208._4_4_;
    fStack_1f0 = (float)local_208._4_4_;
    fStack_1ec = (float)local_208._4_4_;
    fVar38 = patch->patch_v[1][2].field_0.m128[1];
    fVar126 = auVar52._0_4_;
    fVar127 = auVar52._4_4_;
    fVar128 = auVar52._8_4_;
    fVar130 = auVar52._12_4_;
    fVar132 = auVar52._16_4_;
    fVar134 = auVar52._20_4_;
    fVar136 = auVar52._24_4_;
    fVar101 = auVar79._0_4_;
    fVar103 = auVar79._4_4_;
    fVar104 = auVar79._8_4_;
    fVar105 = auVar79._12_4_;
    fVar106 = auVar79._16_4_;
    fVar107 = auVar79._20_4_;
    fVar108 = auVar79._24_4_;
    fVar75 = fVar28 + auVar68._28_4_;
    auVar89._0_4_ = fVar101 + fVar126;
    auVar89._4_4_ = fVar103 + fVar127;
    auVar89._8_4_ = fVar104 + fVar128;
    auVar89._12_4_ = fVar105 + fVar130;
    auVar89._16_4_ = fVar106 + fVar132;
    auVar89._20_4_ = fVar107 + fVar134;
    auVar89._24_4_ = fVar108 + fVar136;
    auVar89._28_4_ = auVar79._28_4_ + auVar52._28_4_;
    auVar24 = vrcpps_avx(auVar89);
    fVar42 = auVar24._0_4_;
    fVar46 = auVar24._4_4_;
    auVar1._4_4_ = fVar46 * auVar89._4_4_;
    auVar1._0_4_ = fVar42 * auVar89._0_4_;
    fVar91 = auVar24._8_4_;
    auVar1._8_4_ = fVar91 * auVar89._8_4_;
    fVar93 = auVar24._12_4_;
    auVar1._12_4_ = fVar93 * auVar89._12_4_;
    fVar95 = auVar24._16_4_;
    auVar1._16_4_ = fVar95 * auVar89._16_4_;
    fVar97 = auVar24._20_4_;
    auVar1._20_4_ = fVar97 * auVar89._20_4_;
    fVar99 = auVar24._24_4_;
    auVar1._24_4_ = fVar99 * auVar89._24_4_;
    auVar1._28_4_ = auVar89._28_4_;
    auVar63 = vsubps_avx(auVar49,auVar1);
    fVar42 = fVar42 + fVar42 * auVar63._0_4_;
    fVar46 = fVar46 + fVar46 * auVar63._4_4_;
    fVar91 = fVar91 + fVar91 * auVar63._8_4_;
    fVar93 = fVar93 + fVar93 * auVar63._12_4_;
    fVar95 = fVar95 + fVar95 * auVar63._16_4_;
    fVar97 = fVar97 + fVar97 * auVar63._20_4_;
    fVar99 = fVar99 + fVar99 * auVar63._24_4_;
    auVar63 = vsubps_avx(auVar49,auVar52);
    local_1a8._4_4_ = (fVar103 * fVar48 + fVar127 * (float)local_148._4_4_) * fVar46;
    local_1a8._0_4_ = (fVar101 * fVar48 + fVar126 * (float)local_148._4_4_) * fVar42;
    fStack_1a0 = (fVar104 * fVar48 + fVar128 * (float)local_148._4_4_) * fVar91;
    fStack_19c = (fVar105 * fVar48 + fVar130 * (float)local_148._4_4_) * fVar93;
    fStack_198 = (fVar106 * fVar48 + fVar132 * (float)local_148._4_4_) * fVar95;
    fStack_194 = (fVar107 * fVar48 + fVar134 * (float)local_148._4_4_) * fVar97;
    fStack_190 = (fVar108 * fVar48 + fVar136 * (float)local_148._4_4_) * fVar99;
    fStack_18c = (float)local_148._4_4_;
    local_1c8._4_4_ = ((float)local_168._4_4_ * fVar127 + fVar103 * fVar21) * fVar46;
    local_1c8._0_4_ = ((float)local_168._4_4_ * fVar126 + fVar101 * fVar21) * fVar42;
    fStack_1c0 = ((float)local_168._4_4_ * fVar128 + fVar104 * fVar21) * fVar91;
    fStack_1bc = ((float)local_168._4_4_ * fVar130 + fVar105 * fVar21) * fVar93;
    fStack_1b8 = ((float)local_168._4_4_ * fVar132 + fVar106 * fVar21) * fVar95;
    fStack_1b4 = ((float)local_168._4_4_ * fVar134 + fVar107 * fVar21) * fVar97;
    fStack_1b0 = ((float)local_168._4_4_ * fVar136 + fVar108 * fVar21) * fVar99;
    fStack_1ac = (float)local_148._4_4_;
    local_1e8._4_4_ = (fVar103 * fVar28 + (float)local_188._4_4_ * fVar127) * fVar46;
    local_1e8._0_4_ = (fVar101 * fVar28 + (float)local_188._4_4_ * fVar126) * fVar42;
    fStack_1e0 = (fVar104 * fVar28 + (float)local_188._4_4_ * fVar128) * fVar91;
    fStack_1dc = (fVar105 * fVar28 + (float)local_188._4_4_ * fVar130) * fVar93;
    fStack_1d8 = (fVar106 * fVar28 + (float)local_188._4_4_ * fVar132) * fVar95;
    fStack_1d4 = (fVar107 * fVar28 + (float)local_188._4_4_ * fVar134) * fVar97;
    fStack_1d0 = (fVar108 * fVar28 + (float)local_188._4_4_ * fVar136) * fVar99;
    fStack_1cc = (float)local_148._4_4_;
    fVar56 = auVar63._0_4_;
    fVar25 = auVar63._4_4_;
    fVar39 = auVar63._8_4_;
    fVar54 = auVar63._12_4_;
    fVar60 = auVar63._16_4_;
    fVar20 = auVar63._20_4_;
    fVar37 = auVar63._24_4_;
    fVar47 = (float)local_148._4_4_ + fVar75;
    fVar48 = patch->patch_v[1][2].field_0.m128[3];
    fVar21 = patch->patch_v[1][2].field_0.m128[2];
    auVar77._0_4_ = fVar56 + fVar101;
    auVar77._4_4_ = fVar25 + fVar103;
    auVar77._8_4_ = fVar39 + fVar104;
    auVar77._12_4_ = fVar54 + fVar105;
    auVar77._16_4_ = fVar60 + fVar106;
    auVar77._20_4_ = fVar20 + fVar107;
    auVar77._24_4_ = fVar37 + fVar108;
    fVar117 = auVar63._28_4_;
    auVar77._28_4_ = fVar117 + auVar79._28_4_;
    auVar63 = vrcpps_avx(auVar77);
    fVar76 = auVar63._0_4_;
    fVar81 = auVar63._4_4_;
    auVar2._4_4_ = auVar77._4_4_ * fVar81;
    auVar2._0_4_ = auVar77._0_4_ * fVar76;
    fVar82 = auVar63._8_4_;
    auVar2._8_4_ = auVar77._8_4_ * fVar82;
    fVar83 = auVar63._12_4_;
    auVar2._12_4_ = auVar77._12_4_ * fVar83;
    fVar84 = auVar63._16_4_;
    auVar2._16_4_ = auVar77._16_4_ * fVar84;
    fVar85 = auVar63._20_4_;
    auVar2._20_4_ = auVar77._20_4_ * fVar85;
    fVar86 = auVar63._24_4_;
    auVar2._24_4_ = auVar77._24_4_ * fVar86;
    auVar2._28_4_ = auVar77._28_4_;
    auVar63 = vsubps_avx(auVar49,auVar2);
    fVar76 = fVar76 + fVar76 * auVar63._0_4_;
    fVar81 = fVar81 + fVar81 * auVar63._4_4_;
    fVar82 = fVar82 + fVar82 * auVar63._8_4_;
    fVar83 = fVar83 + fVar83 * auVar63._12_4_;
    fVar84 = fVar84 + fVar84 * auVar63._16_4_;
    fVar85 = fVar85 + fVar85 * auVar63._20_4_;
    fVar86 = fVar86 + fVar86 * auVar63._24_4_;
    fVar28 = patch->patch_v[2][0].field_0.m128[3];
    fVar42 = patch->patch_v[2][1].field_0.m128[3];
    auVar79 = vsubps_avx(auVar49,auVar79);
    fVar65 = auVar79._0_4_;
    fVar87 = auVar79._4_4_;
    fVar109 = auVar79._8_4_;
    fVar129 = auVar79._12_4_;
    fVar131 = auVar79._16_4_;
    fVar133 = auVar79._20_4_;
    fVar135 = auVar79._24_4_;
    fVar46 = patch->patch_v[2][2].field_0.m128[0];
    fVar91 = patch->patch_v[2][2].field_0.m128[1];
    fVar93 = patch->patch_v[2][2].field_0.m128[3];
    fVar95 = patch->patch_v[2][2].field_0.m128[2];
    auVar138._4_4_ = fVar95;
    auVar138._0_4_ = fVar95;
    auVar138._8_4_ = fVar95;
    auVar138._12_4_ = fVar95;
    auVar138._16_4_ = fVar95;
    auVar138._20_4_ = fVar95;
    auVar138._24_4_ = fVar95;
    auVar138._28_4_ = fVar95;
    auVar50._0_4_ = fVar56 + fVar65;
    auVar50._4_4_ = fVar25 + fVar87;
    auVar50._8_4_ = fVar39 + fVar109;
    auVar50._12_4_ = fVar54 + fVar129;
    auVar50._16_4_ = fVar60 + fVar131;
    auVar50._20_4_ = fVar20 + fVar133;
    auVar50._24_4_ = fVar37 + fVar135;
    fVar64 = auVar79._28_4_;
    auVar50._28_4_ = fVar117 + fVar64;
    auVar77 = vrcpps_avx(auVar50);
    fVar18 = auVar77._0_4_;
    fVar26 = auVar77._4_4_;
    auVar4._4_4_ = auVar50._4_4_ * fVar26;
    auVar4._0_4_ = auVar50._0_4_ * fVar18;
    fVar29 = auVar77._8_4_;
    auVar4._8_4_ = auVar50._8_4_ * fVar29;
    fVar32 = auVar77._12_4_;
    auVar4._12_4_ = auVar50._12_4_ * fVar32;
    fVar35 = auVar77._16_4_;
    auVar4._16_4_ = auVar50._16_4_ * fVar35;
    fVar40 = auVar77._20_4_;
    auVar4._20_4_ = auVar50._20_4_ * fVar40;
    fVar44 = auVar77._24_4_;
    auVar4._24_4_ = auVar50._24_4_ * fVar44;
    auVar4._28_4_ = auVar50._28_4_;
    auVar4 = vsubps_avx(auVar49,auVar4);
    fVar18 = fVar18 + fVar18 * auVar4._0_4_;
    fVar26 = fVar26 + fVar26 * auVar4._4_4_;
    fVar29 = fVar29 + fVar29 * auVar4._8_4_;
    fVar32 = fVar32 + fVar32 * auVar4._12_4_;
    fVar35 = fVar35 + fVar35 * auVar4._16_4_;
    fVar40 = fVar40 + fVar40 * auVar4._20_4_;
    fVar44 = fVar44 + fVar44 * auVar4._24_4_;
    auVar3._4_4_ = (fVar87 * fVar28 + fVar25 * fVar46) * fVar26;
    auVar3._0_4_ = (fVar65 * fVar28 + fVar56 * fVar46) * fVar18;
    auVar3._8_4_ = (fVar109 * fVar28 + fVar39 * fVar46) * fVar29;
    auVar3._12_4_ = (fVar129 * fVar28 + fVar54 * fVar46) * fVar32;
    auVar3._16_4_ = (fVar131 * fVar28 + fVar60 * fVar46) * fVar35;
    auVar3._20_4_ = (fVar133 * fVar28 + fVar20 * fVar46) * fVar40;
    auVar3._24_4_ = (fVar135 * fVar28 + fVar37 * fVar46) * fVar44;
    auVar3._28_4_ = auVar24._28_4_;
    fVar97 = patch->patch_v[3][0].field_0.m128[3];
    fVar99 = patch->patch_v[3][1].field_0.m128[3];
    fVar43 = patch->patch_v[2][1].field_0.m128[0];
    auVar78._4_4_ = fVar43;
    auVar78._0_4_ = fVar43;
    auVar78._8_4_ = fVar43;
    auVar78._12_4_ = fVar43;
    auVar78._16_4_ = fVar43;
    auVar78._20_4_ = fVar43;
    auVar78._24_4_ = fVar43;
    auVar78._28_4_ = fVar43;
    fVar137 = patch->patch_v[2][1].field_0.m128[1];
    auVar140._4_4_ = fVar137;
    auVar140._0_4_ = fVar137;
    auVar140._8_4_ = fVar137;
    auVar140._12_4_ = fVar137;
    auVar140._16_4_ = fVar137;
    auVar140._20_4_ = fVar137;
    auVar140._24_4_ = fVar137;
    auVar140._28_4_ = fVar137;
    fVar53 = patch->patch_v[3][2].field_0.m128[3];
    fVar55 = patch->patch_v[2][1].field_0.m128[2];
    auVar67._4_4_ = fVar55;
    auVar67._0_4_ = fVar55;
    auVar67._8_4_ = fVar55;
    auVar67._12_4_ = fVar55;
    auVar67._16_4_ = fVar55;
    auVar67._20_4_ = fVar55;
    auVar67._24_4_ = fVar55;
    auVar67._28_4_ = fVar55;
    auVar51._0_4_ = fVar65 + fVar126;
    auVar51._4_4_ = fVar87 + fVar127;
    auVar51._8_4_ = fVar109 + fVar128;
    auVar51._12_4_ = fVar129 + fVar130;
    auVar51._16_4_ = fVar131 + fVar132;
    auVar51._20_4_ = fVar133 + fVar134;
    auVar51._24_4_ = fVar135 + fVar136;
    auVar51._28_4_ = fVar64 + auVar52._28_4_;
    auVar52 = vrcpps_avx(auVar51);
    fVar19 = auVar52._0_4_;
    fVar27 = auVar52._4_4_;
    auVar5._4_4_ = auVar51._4_4_ * fVar27;
    auVar5._0_4_ = auVar51._0_4_ * fVar19;
    fVar30 = auVar52._8_4_;
    auVar5._8_4_ = auVar51._8_4_ * fVar30;
    fVar33 = auVar52._12_4_;
    auVar5._12_4_ = auVar51._12_4_ * fVar33;
    fVar36 = auVar52._16_4_;
    auVar5._16_4_ = auVar51._16_4_ * fVar36;
    fVar41 = auVar52._20_4_;
    auVar5._20_4_ = auVar51._20_4_ * fVar41;
    fVar45 = auVar52._24_4_;
    auVar5._24_4_ = auVar51._24_4_ * fVar45;
    auVar5._28_4_ = auVar51._28_4_;
    auVar139._8_4_ = 0x3f800000;
    auVar139._0_8_ = 0x3f8000003f800000;
    auVar139._12_4_ = 0x3f800000;
    auVar139._16_4_ = 0x3f800000;
    auVar139._20_4_ = 0x3f800000;
    auVar139._24_4_ = 0x3f800000;
    auVar139._28_4_ = 0x3f800000;
    auVar79 = vsubps_avx(auVar139,auVar5);
    fVar62 = auVar79._28_4_;
    fVar19 = fVar19 + fVar19 * auVar79._0_4_;
    fVar27 = fVar27 + fVar27 * auVar79._4_4_;
    fVar30 = fVar30 + fVar30 * auVar79._8_4_;
    fVar33 = fVar33 + fVar33 * auVar79._12_4_;
    fVar36 = fVar36 + fVar36 * auVar79._16_4_;
    fVar41 = fVar41 + fVar41 * auVar79._20_4_;
    fVar45 = fVar45 + fVar45 * auVar79._24_4_;
    auVar6._4_4_ = (fVar87 * fVar43 + fVar97 * fVar127) * fVar27;
    auVar6._0_4_ = (fVar65 * fVar43 + fVar97 * fVar126) * fVar19;
    auVar6._8_4_ = (fVar109 * fVar43 + fVar97 * fVar128) * fVar30;
    auVar6._12_4_ = (fVar129 * fVar43 + fVar97 * fVar130) * fVar33;
    auVar6._16_4_ = (fVar131 * fVar43 + fVar97 * fVar132) * fVar36;
    auVar6._20_4_ = (fVar133 * fVar43 + fVar97 * fVar134) * fVar41;
    auVar6._24_4_ = (fVar135 * fVar43 + fVar97 * fVar136) * fVar45;
    auVar6._28_4_ = fVar62;
    auVar7._4_4_ = (fVar87 * fVar137 + fVar99 * fVar127) * fVar27;
    auVar7._0_4_ = (fVar65 * fVar137 + fVar99 * fVar126) * fVar19;
    auVar7._8_4_ = (fVar109 * fVar137 + fVar99 * fVar128) * fVar30;
    auVar7._12_4_ = (fVar129 * fVar137 + fVar99 * fVar130) * fVar33;
    auVar7._16_4_ = (fVar131 * fVar137 + fVar99 * fVar132) * fVar36;
    auVar7._20_4_ = (fVar133 * fVar137 + fVar99 * fVar134) * fVar41;
    auVar7._24_4_ = (fVar135 * fVar137 + fVar99 * fVar136) * fVar45;
    auVar7._28_4_ = in_register_000015dc + fVar28 + fVar48 + fVar21;
    auVar8._4_4_ = (fVar53 * fVar127 + fVar87 * fVar55) * fVar27;
    auVar8._0_4_ = (fVar53 * fVar126 + fVar65 * fVar55) * fVar19;
    auVar8._8_4_ = (fVar53 * fVar128 + fVar109 * fVar55) * fVar30;
    auVar8._12_4_ = (fVar53 * fVar130 + fVar129 * fVar55) * fVar33;
    auVar8._16_4_ = (fVar53 * fVar132 + fVar131 * fVar55) * fVar36;
    auVar8._20_4_ = (fVar53 * fVar134 + fVar133 * fVar55) * fVar41;
    auVar8._24_4_ = (fVar53 * fVar136 + fVar135 * fVar55) * fVar45;
    auVar8._28_4_ = auVar52._28_4_ + fVar62;
    auVar52 = vblendvps_avx(_local_1a8,_local_148,auVar23);
    auVar79 = vblendvps_avx(_local_1c8,_local_168,auVar23);
    auVar24 = vblendvps_avx(_local_1e8,_local_188,auVar23);
    auVar15._4_4_ = (fVar31 * fVar25 + fVar103 * (float)local_208._4_4_) * fVar81;
    auVar15._0_4_ = (fVar31 * fVar56 + fVar101 * (float)local_208._4_4_) * fVar76;
    auVar15._8_4_ = (fVar31 * fVar39 + fVar104 * (float)local_208._4_4_) * fVar82;
    auVar15._12_4_ = (fVar31 * fVar54 + fVar105 * (float)local_208._4_4_) * fVar83;
    auVar15._16_4_ = (fVar31 * fVar60 + fVar106 * (float)local_208._4_4_) * fVar84;
    auVar15._20_4_ = (fVar31 * fVar20 + fVar107 * (float)local_208._4_4_) * fVar85;
    auVar15._24_4_ = (fVar31 * fVar37 + fVar108 * (float)local_208._4_4_) * fVar86;
    auVar15._28_4_ = fVar47;
    auVar63 = vblendvps_avx(auVar15,_local_208,auVar23);
    auVar14._4_4_ = (fVar25 * fVar34 + fVar103 * fVar38) * fVar81;
    auVar14._0_4_ = (fVar56 * fVar34 + fVar101 * fVar38) * fVar76;
    auVar14._8_4_ = (fVar39 * fVar34 + fVar104 * fVar38) * fVar82;
    auVar14._12_4_ = (fVar54 * fVar34 + fVar105 * fVar38) * fVar83;
    auVar14._16_4_ = (fVar60 * fVar34 + fVar106 * fVar38) * fVar84;
    auVar14._20_4_ = (fVar20 * fVar34 + fVar107 * fVar38) * fVar85;
    auVar14._24_4_ = (fVar37 * fVar34 + fVar108 * fVar38) * fVar86;
    auVar14._28_4_ = fVar47;
    auVar17._4_4_ = fVar38;
    auVar17._0_4_ = fVar38;
    auVar17._8_4_ = fVar38;
    auVar17._12_4_ = fVar38;
    auVar17._16_4_ = fVar38;
    auVar17._20_4_ = fVar38;
    auVar17._24_4_ = fVar38;
    auVar17._28_4_ = fVar38;
    auVar68 = vblendvps_avx(auVar14,auVar17,auVar23);
    auVar13._4_4_ = (fVar25 * fVar48 + fVar103 * fVar21) * fVar81;
    auVar13._0_4_ = (fVar56 * fVar48 + fVar101 * fVar21) * fVar76;
    auVar13._8_4_ = (fVar39 * fVar48 + fVar104 * fVar21) * fVar82;
    auVar13._12_4_ = (fVar54 * fVar48 + fVar105 * fVar21) * fVar83;
    auVar13._16_4_ = (fVar60 * fVar48 + fVar106 * fVar21) * fVar84;
    auVar13._20_4_ = (fVar20 * fVar48 + fVar107 * fVar21) * fVar85;
    auVar13._24_4_ = (fVar37 * fVar48 + fVar108 * fVar21) * fVar86;
    auVar13._28_4_ = fVar34 + fVar75;
    auVar16._4_4_ = fVar21;
    auVar16._0_4_ = fVar21;
    auVar16._8_4_ = fVar21;
    auVar16._12_4_ = fVar21;
    auVar16._16_4_ = fVar21;
    auVar16._20_4_ = fVar21;
    auVar16._24_4_ = fVar21;
    auVar16._28_4_ = fVar21;
    auVar80 = vblendvps_avx(auVar13,auVar16,auVar23);
    auVar12._4_4_ = fVar46;
    auVar12._0_4_ = fVar46;
    auVar12._8_4_ = fVar46;
    auVar12._12_4_ = fVar46;
    auVar12._16_4_ = fVar46;
    auVar12._20_4_ = fVar46;
    auVar12._24_4_ = fVar46;
    auVar12._28_4_ = fVar46;
    auVar1 = vblendvps_avx(auVar3,auVar12,auVar23);
    auVar10._4_4_ = (fVar87 * fVar42 + fVar25 * fVar91) * fVar26;
    auVar10._0_4_ = (fVar65 * fVar42 + fVar56 * fVar91) * fVar18;
    auVar10._8_4_ = (fVar109 * fVar42 + fVar39 * fVar91) * fVar29;
    auVar10._12_4_ = (fVar129 * fVar42 + fVar54 * fVar91) * fVar32;
    auVar10._16_4_ = (fVar131 * fVar42 + fVar60 * fVar91) * fVar35;
    auVar10._20_4_ = (fVar133 * fVar42 + fVar20 * fVar91) * fVar40;
    auVar10._24_4_ = (fVar135 * fVar42 + fVar37 * fVar91) * fVar44;
    auVar10._28_4_ = auVar4._28_4_;
    auVar11._4_4_ = fVar91;
    auVar11._0_4_ = fVar91;
    auVar11._8_4_ = fVar91;
    auVar11._12_4_ = fVar91;
    auVar11._16_4_ = fVar91;
    auVar11._20_4_ = fVar91;
    auVar11._24_4_ = fVar91;
    auVar11._28_4_ = fVar91;
    auVar2 = vblendvps_avx(auVar10,auVar11,auVar23);
    auVar9._4_4_ = (fVar25 * fVar95 + fVar87 * fVar93) * fVar26;
    auVar9._0_4_ = (fVar56 * fVar95 + fVar65 * fVar93) * fVar18;
    auVar9._8_4_ = (fVar39 * fVar95 + fVar109 * fVar93) * fVar29;
    auVar9._12_4_ = (fVar54 * fVar95 + fVar129 * fVar93) * fVar32;
    auVar9._16_4_ = (fVar60 * fVar95 + fVar131 * fVar93) * fVar35;
    auVar9._20_4_ = (fVar20 * fVar95 + fVar133 * fVar93) * fVar40;
    auVar9._24_4_ = (fVar37 * fVar95 + fVar135 * fVar93) * fVar44;
    auVar9._28_4_ = auVar77._28_4_ + auVar4._28_4_;
    auVar77 = vblendvps_avx(auVar9,auVar138,auVar23);
    auVar4 = vblendvps_avx(auVar6,auVar78,auVar23);
    auVar3 = vblendvps_avx(auVar7,auVar140,auVar23);
    auVar23 = vblendvps_avx(auVar8,auVar67,auVar23);
    fVar45 = fVar56 * fVar56 * fVar56;
    fVar47 = fVar25 * fVar25 * fVar25;
    fVar75 = fVar39 * fVar39 * fVar39;
    fVar57 = fVar54 * fVar54 * fVar54;
    fVar58 = fVar60 * fVar60 * fVar60;
    fVar59 = fVar20 * fVar20 * fVar20;
    fVar61 = fVar37 * fVar37 * fVar37;
    fVar118 = fVar65 * fVar65 * fVar65;
    fVar120 = fVar87 * fVar87 * fVar87;
    fVar121 = fVar109 * fVar109 * fVar109;
    fVar122 = fVar129 * fVar129 * fVar129;
    fVar123 = fVar131 * fVar131 * fVar131;
    fVar124 = fVar133 * fVar133 * fVar133;
    fVar125 = fVar135 * fVar135 * fVar135;
    fVar66 = fVar56 * fVar56 * fVar126 * 3.0;
    fVar69 = fVar25 * fVar25 * fVar127 * 3.0;
    fVar70 = fVar39 * fVar39 * fVar128 * 3.0;
    fVar71 = fVar54 * fVar54 * fVar130 * 3.0;
    fVar72 = fVar60 * fVar60 * fVar132 * 3.0;
    fVar73 = fVar20 * fVar20 * fVar134 * 3.0;
    fVar74 = fVar37 * fVar37 * fVar136 * 3.0;
    fVar88 = fVar65 * fVar101 * fVar65 * 3.0;
    fVar90 = fVar87 * fVar103 * fVar87 * 3.0;
    fVar92 = fVar109 * fVar104 * fVar109 * 3.0;
    fVar94 = fVar129 * fVar105 * fVar129 * 3.0;
    fVar96 = fVar131 * fVar106 * fVar131 * 3.0;
    fVar98 = fVar133 * fVar107 * fVar133 * 3.0;
    fVar100 = fVar135 * fVar108 * fVar135 * 3.0;
    fVar110 = fVar126 * fVar56 * fVar126 * 3.0;
    fVar111 = fVar127 * fVar25 * fVar127 * 3.0;
    fVar112 = fVar128 * fVar39 * fVar128 * 3.0;
    fVar113 = fVar130 * fVar54 * fVar130 * 3.0;
    fVar114 = fVar132 * fVar60 * fVar132 * 3.0;
    fVar115 = fVar134 * fVar20 * fVar134 * 3.0;
    fVar116 = fVar136 * fVar37 * fVar136 * 3.0;
    fVar20 = fVar101 * fVar101 * fVar65 * 3.0;
    fVar85 = fVar103 * fVar103 * fVar87 * 3.0;
    fVar40 = fVar104 * fVar104 * fVar109 * 3.0;
    fVar41 = fVar105 * fVar105 * fVar129 * 3.0;
    fVar37 = fVar106 * fVar106 * fVar131 * 3.0;
    fVar86 = fVar107 * fVar107 * fVar133 * 3.0;
    fVar44 = fVar108 * fVar108 * fVar135 * 3.0;
    fVar126 = fVar126 * fVar126 * fVar126;
    fVar127 = fVar127 * fVar127 * fVar127;
    fVar128 = fVar128 * fVar128 * fVar128;
    fVar130 = fVar130 * fVar130 * fVar130;
    fVar132 = fVar132 * fVar132 * fVar132;
    fVar134 = fVar134 * fVar134 * fVar134;
    fVar136 = fVar136 * fVar136 * fVar136;
    fVar101 = fVar101 * fVar101 * fVar101;
    fVar103 = fVar103 * fVar103 * fVar103;
    fVar104 = fVar104 * fVar104 * fVar104;
    fVar105 = fVar105 * fVar105 * fVar105;
    fVar106 = fVar106 * fVar106 * fVar106;
    fVar107 = fVar107 * fVar107 * fVar107;
    fVar108 = fVar108 * fVar108 * fVar108;
    fVar48 = patch->patch_v[0][2].field_0.m128[0];
    fVar21 = patch->patch_v[0][3].field_0.m128[0];
    fVar28 = patch->patch_v[0][1].field_0.m128[0];
    fVar31 = patch->patch_v[0][0].field_0.m128[0];
    fVar34 = patch->patch_v[1][3].field_0.m128[0];
    local_208._0_4_ = auVar63._0_4_;
    local_208._4_4_ = auVar63._4_4_;
    fStack_200 = auVar63._8_4_;
    fStack_1fc = auVar63._12_4_;
    fStack_1f8 = auVar63._16_4_;
    fStack_1f4 = auVar63._20_4_;
    fStack_1f0 = auVar63._24_4_;
    fVar38 = patch->patch_v[1][0].field_0.m128[0];
    fVar42 = patch->patch_v[2][3].field_0.m128[0];
    fVar46 = patch->patch_v[2][0].field_0.m128[0];
    fVar91 = patch->patch_v[3][3].field_0.m128[0];
    fVar93 = patch->patch_v[3][2].field_0.m128[0];
    fVar95 = patch->patch_v[3][1].field_0.m128[0];
    fVar97 = patch->patch_v[3][0].field_0.m128[0];
    fVar109 = fVar46 + auVar4._28_4_ + auVar1._28_4_ + fVar42 + fVar97 + fVar95 + fVar93 + fVar91;
    fVar65 = fVar109 + fVar38 + auVar52._28_4_ + fVar34 + fVar21 + fVar21 + fVar48;
    fVar99 = patch->patch_v[0][3].field_0.m128[1];
    fVar43 = patch->patch_v[0][2].field_0.m128[1];
    fVar137 = patch->patch_v[0][1].field_0.m128[1];
    fVar53 = patch->patch_v[0][0].field_0.m128[1];
    fVar56 = patch->patch_v[1][3].field_0.m128[1];
    local_1e8._0_4_ = auVar68._0_4_;
    local_1e8._4_4_ = auVar68._4_4_;
    fStack_1e0 = auVar68._8_4_;
    fStack_1dc = auVar68._12_4_;
    fStack_1d8 = auVar68._16_4_;
    fStack_1d4 = auVar68._20_4_;
    fStack_1d0 = auVar68._24_4_;
    local_1c8._0_4_ = auVar79._0_4_;
    local_1c8._4_4_ = auVar79._4_4_;
    fStack_1c0 = auVar79._8_4_;
    fStack_1bc = auVar79._12_4_;
    fStack_1b8 = auVar79._16_4_;
    fStack_1b4 = auVar79._20_4_;
    fStack_1b0 = auVar79._24_4_;
    fVar76 = patch->patch_v[1][0].field_0.m128[1];
    fVar18 = patch->patch_v[2][3].field_0.m128[1];
    fVar19 = patch->patch_v[2][0].field_0.m128[1];
    fVar25 = patch->patch_v[3][2].field_0.m128[1];
    fVar81 = patch->patch_v[3][3].field_0.m128[1];
    fVar26 = patch->patch_v[3][1].field_0.m128[1];
    fVar27 = patch->patch_v[3][0].field_0.m128[1];
    fVar87 = fVar81 + fVar81 + fVar81 + fVar25;
    fVar39 = patch->patch_v[0][2].field_0.m128[2];
    fVar82 = patch->patch_v[0][3].field_0.m128[2];
    fVar29 = patch->patch_v[0][1].field_0.m128[2];
    fVar30 = patch->patch_v[0][0].field_0.m128[2];
    fVar54 = patch->patch_v[1][3].field_0.m128[2];
    local_1a8._0_4_ = auVar80._0_4_;
    local_1a8._4_4_ = auVar80._4_4_;
    fStack_1a0 = auVar80._8_4_;
    fStack_19c = auVar80._12_4_;
    fStack_198 = auVar80._16_4_;
    fStack_194 = auVar80._20_4_;
    fStack_190 = auVar80._24_4_;
    local_188._0_4_ = auVar24._0_4_;
    local_188._4_4_ = auVar24._4_4_;
    fStack_180 = auVar24._8_4_;
    fStack_17c = auVar24._12_4_;
    fStack_178 = auVar24._16_4_;
    fStack_174 = auVar24._20_4_;
    fStack_170 = auVar24._24_4_;
    fVar83 = patch->patch_v[1][0].field_0.m128[2];
    fVar32 = patch->patch_v[2][3].field_0.m128[2];
    local_148._0_4_ = auVar77._0_4_;
    local_148._4_4_ = auVar77._4_4_;
    fStack_140 = auVar77._8_4_;
    fStack_13c = auVar77._12_4_;
    fStack_138 = auVar77._16_4_;
    fStack_134 = auVar77._20_4_;
    fStack_130 = auVar77._24_4_;
    fVar33 = patch->patch_v[2][0].field_0.m128[2];
    local_168._0_4_ = auVar23._0_4_;
    local_168._4_4_ = auVar23._4_4_;
    fStack_160 = auVar23._8_4_;
    fStack_15c = auVar23._12_4_;
    fStack_158 = auVar23._16_4_;
    fStack_154 = auVar23._20_4_;
    fStack_150 = auVar23._24_4_;
    fVar60 = patch->patch_v[3][3].field_0.m128[2];
    fVar84 = patch->patch_v[3][2].field_0.m128[2];
    fVar35 = patch->patch_v[3][1].field_0.m128[2];
    fVar36 = patch->patch_v[3][0].field_0.m128[2];
    fVar62 = fVar62 + fVar117 + fVar64 + fVar55;
    *(float *)&in_RDI->field_0 =
         fVar118 * (fVar31 * fVar45 + fVar28 * fVar66 + fVar126 * fVar21 + fVar110 * fVar48) +
         (fVar46 * fVar45 + auVar4._0_4_ * fVar66 + fVar110 * auVar1._0_4_ + fVar126 * fVar42) *
         fVar20 + (fVar97 * fVar45 + fVar95 * fVar66 + fVar110 * fVar93 + fVar126 * fVar91) *
                  fVar101 +
         fVar88 * (fVar38 * fVar45 +
                  auVar52._0_4_ * fVar66 + fVar110 * (float)local_208._0_4_ + fVar126 * fVar34);
    *(float *)((long)&in_RDI->field_0 + 4) =
         fVar120 * (fVar31 * fVar47 + fVar28 * fVar69 + fVar127 * fVar21 + fVar111 * fVar48) +
         (fVar46 * fVar47 + auVar4._4_4_ * fVar69 + fVar111 * auVar1._4_4_ + fVar127 * fVar42) *
         fVar85 + (fVar97 * fVar47 + fVar95 * fVar69 + fVar111 * fVar93 + fVar127 * fVar91) *
                  fVar103 +
         fVar90 * (fVar38 * fVar47 +
                  auVar52._4_4_ * fVar69 + fVar111 * (float)local_208._4_4_ + fVar127 * fVar34);
    *(float *)((long)&in_RDI->field_0 + 8) =
         fVar121 * (fVar31 * fVar75 + fVar28 * fVar70 + fVar128 * fVar21 + fVar112 * fVar48) +
         (fVar46 * fVar75 + auVar4._8_4_ * fVar70 + fVar112 * auVar1._8_4_ + fVar128 * fVar42) *
         fVar40 + (fVar97 * fVar75 + fVar95 * fVar70 + fVar112 * fVar93 + fVar128 * fVar91) *
                  fVar104 +
         fVar92 * (fVar38 * fVar75 +
                  auVar52._8_4_ * fVar70 + fVar112 * fStack_200 + fVar128 * fVar34);
    *(float *)((long)&in_RDI->field_0 + 0xc) =
         fVar122 * (fVar31 * fVar57 + fVar28 * fVar71 + fVar130 * fVar21 + fVar113 * fVar48) +
         (fVar46 * fVar57 + auVar4._12_4_ * fVar71 + fVar113 * auVar1._12_4_ + fVar130 * fVar42) *
         fVar41 + (fVar97 * fVar57 + fVar95 * fVar71 + fVar113 * fVar93 + fVar130 * fVar91) *
                  fVar105 +
         fVar94 * (fVar38 * fVar57 +
                  auVar52._12_4_ * fVar71 + fVar113 * fStack_1fc + fVar130 * fVar34);
    *(float *)((long)&in_RDI->field_0 + 0x10) =
         fVar123 * (fVar31 * fVar58 + fVar28 * fVar72 + fVar132 * fVar21 + fVar114 * fVar48) +
         (fVar46 * fVar58 + auVar4._16_4_ * fVar72 + fVar114 * auVar1._16_4_ + fVar132 * fVar42) *
         fVar37 + (fVar97 * fVar58 + fVar95 * fVar72 + fVar114 * fVar93 + fVar132 * fVar91) *
                  fVar106 +
         fVar96 * (fVar38 * fVar58 +
                  auVar52._16_4_ * fVar72 + fVar114 * fStack_1f8 + fVar132 * fVar34);
    *(float *)((long)&in_RDI->field_0 + 0x14) =
         fVar124 * (fVar31 * fVar59 + fVar28 * fVar73 + fVar134 * fVar21 + fVar115 * fVar48) +
         (fVar46 * fVar59 + auVar4._20_4_ * fVar73 + fVar115 * auVar1._20_4_ + fVar134 * fVar42) *
         fVar86 + (fVar97 * fVar59 + fVar95 * fVar73 + fVar115 * fVar93 + fVar134 * fVar91) *
                  fVar107 +
         fVar98 * (fVar38 * fVar59 +
                  auVar52._20_4_ * fVar73 + fVar115 * fStack_1f4 + fVar134 * fVar34);
    *(float *)((long)&in_RDI->field_0 + 0x18) =
         fVar125 * (fVar31 * fVar61 + fVar28 * fVar74 + fVar136 * fVar21 + fVar116 * fVar48) +
         (fVar46 * fVar61 + auVar4._24_4_ * fVar74 + fVar116 * auVar1._24_4_ + fVar136 * fVar42) *
         fVar44 + (fVar97 * fVar61 + fVar95 * fVar74 + fVar116 * fVar93 + fVar136 * fVar91) *
                  fVar108 +
         fVar100 * (fVar38 * fVar61 +
                   auVar52._24_4_ * fVar74 + fVar116 * fStack_1f0 + fVar136 * fVar34);
    *(float *)((long)&in_RDI->field_0 + 0x1c) = fVar109 + fVar65;
    *(float *)((long)&in_RDI->field_0 + 0x20) =
         fVar118 * (fVar53 * fVar45 + fVar137 * fVar66 + fVar110 * fVar43 + fVar126 * fVar99) +
         (fVar76 * fVar45 +
         fVar66 * (float)local_1c8._0_4_ + fVar110 * (float)local_1e8._0_4_ + fVar126 * fVar56) *
         fVar88 + fVar20 * (fVar45 * fVar19 +
                           fVar66 * auVar3._0_4_ + fVar126 * fVar18 + fVar110 * auVar2._0_4_) +
                  fVar101 * (fVar27 * fVar45 + fVar26 * fVar66 + fVar126 * fVar81 + fVar110 * fVar25
                            );
    *(float *)((long)&in_RDI->field_0 + 0x24) =
         fVar120 * (fVar53 * fVar47 + fVar137 * fVar69 + fVar111 * fVar43 + fVar127 * fVar99) +
         (fVar76 * fVar47 +
         fVar69 * (float)local_1c8._4_4_ + fVar111 * (float)local_1e8._4_4_ + fVar127 * fVar56) *
         fVar90 + fVar85 * (fVar47 * fVar19 +
                           fVar69 * auVar3._4_4_ + fVar127 * fVar18 + fVar111 * auVar2._4_4_) +
                  fVar103 * (fVar27 * fVar47 + fVar26 * fVar69 + fVar127 * fVar81 + fVar111 * fVar25
                            );
    *(float *)((long)&in_RDI->field_0 + 0x28) =
         fVar121 * (fVar53 * fVar75 + fVar137 * fVar70 + fVar112 * fVar43 + fVar128 * fVar99) +
         (fVar76 * fVar75 + fVar70 * fStack_1c0 + fVar112 * fStack_1e0 + fVar128 * fVar56) * fVar92
         + fVar40 * (fVar75 * fVar19 +
                    fVar70 * auVar3._8_4_ + fVar128 * fVar18 + fVar112 * auVar2._8_4_) +
           fVar104 * (fVar27 * fVar75 + fVar26 * fVar70 + fVar128 * fVar81 + fVar112 * fVar25);
    *(float *)((long)&in_RDI->field_0 + 0x2c) =
         fVar122 * (fVar53 * fVar57 + fVar137 * fVar71 + fVar113 * fVar43 + fVar130 * fVar99) +
         (fVar76 * fVar57 + fVar71 * fStack_1bc + fVar113 * fStack_1dc + fVar130 * fVar56) * fVar94
         + fVar41 * (fVar57 * fVar19 +
                    fVar71 * auVar3._12_4_ + fVar130 * fVar18 + fVar113 * auVar2._12_4_) +
           fVar105 * (fVar27 * fVar57 + fVar26 * fVar71 + fVar130 * fVar81 + fVar113 * fVar25);
    *(float *)((long)&in_RDI->field_0 + 0x30) =
         fVar123 * (fVar53 * fVar58 + fVar137 * fVar72 + fVar114 * fVar43 + fVar132 * fVar99) +
         (fVar76 * fVar58 + fVar72 * fStack_1b8 + fVar114 * fStack_1d8 + fVar132 * fVar56) * fVar96
         + fVar37 * (fVar58 * fVar19 +
                    fVar72 * auVar3._16_4_ + fVar132 * fVar18 + fVar114 * auVar2._16_4_) +
           fVar106 * (fVar27 * fVar58 + fVar26 * fVar72 + fVar132 * fVar81 + fVar114 * fVar25);
    *(float *)((long)&in_RDI->field_0 + 0x34) =
         fVar124 * (fVar53 * fVar59 + fVar137 * fVar73 + fVar115 * fVar43 + fVar134 * fVar99) +
         (fVar76 * fVar59 + fVar73 * fStack_1b4 + fVar115 * fStack_1d4 + fVar134 * fVar56) * fVar98
         + fVar86 * (fVar59 * fVar19 +
                    fVar73 * auVar3._20_4_ + fVar134 * fVar18 + fVar115 * auVar2._20_4_) +
           fVar107 * (fVar27 * fVar59 + fVar26 * fVar73 + fVar134 * fVar81 + fVar115 * fVar25);
    *(float *)((long)&in_RDI->field_0 + 0x38) =
         fVar125 * (fVar53 * fVar61 + fVar137 * fVar74 + fVar116 * fVar43 + fVar136 * fVar99) +
         (fVar76 * fVar61 + fVar74 * fStack_1b0 + fVar116 * fStack_1d0 + fVar136 * fVar56) * fVar100
         + fVar44 * (fVar61 * fVar19 +
                    fVar74 * auVar3._24_4_ + fVar136 * fVar18 + fVar116 * auVar2._24_4_) +
           fVar108 * (fVar27 * fVar61 + fVar26 * fVar74 + fVar136 * fVar81 + fVar116 * fVar25);
    *(float *)((long)&in_RDI->field_0 + 0x3c) =
         fVar53 + fVar137 + fVar43 + fVar65 +
         fVar87 + fVar19 + auVar3._28_4_ + fVar18 + auVar2._28_4_ + fVar87;
    *(float *)((long)&in_RDI->field_0 + 0x40) =
         fVar118 * (fVar45 * fVar30 + fVar66 * fVar29 + fVar110 * fVar39 + fVar126 * fVar82) +
         fVar88 * (fVar83 * fVar45 +
                  fVar66 * (float)local_188._0_4_ +
                  fVar110 * (float)local_1a8._0_4_ + fVar126 * fVar54) +
         (fVar33 * fVar45 +
         fVar66 * (float)local_168._0_4_ + fVar110 * (float)local_148._0_4_ + fVar126 * fVar32) *
         fVar20 + fVar101 * (fVar36 * fVar45 + fVar110 * fVar84 + fVar126 * fVar60 + fVar35 * fVar66
                            );
    *(float *)((long)&in_RDI->field_0 + 0x44) =
         fVar120 * (fVar47 * fVar30 + fVar69 * fVar29 + fVar111 * fVar39 + fVar127 * fVar82) +
         fVar90 * (fVar83 * fVar47 +
                  fVar69 * (float)local_188._4_4_ +
                  fVar111 * (float)local_1a8._4_4_ + fVar127 * fVar54) +
         (fVar33 * fVar47 +
         fVar69 * (float)local_168._4_4_ + fVar111 * (float)local_148._4_4_ + fVar127 * fVar32) *
         fVar85 + fVar103 * (fVar36 * fVar47 + fVar111 * fVar84 + fVar127 * fVar60 + fVar35 * fVar69
                            );
    *(float *)((long)&in_RDI->field_0 + 0x48) =
         fVar121 * (fVar75 * fVar30 + fVar70 * fVar29 + fVar112 * fVar39 + fVar128 * fVar82) +
         fVar92 * (fVar83 * fVar75 + fVar70 * fStack_180 + fVar112 * fStack_1a0 + fVar128 * fVar54)
         + (fVar33 * fVar75 + fVar70 * fStack_160 + fVar112 * fStack_140 + fVar128 * fVar32) *
           fVar40 + fVar104 * (fVar36 * fVar75 +
                              fVar112 * fVar84 + fVar128 * fVar60 + fVar35 * fVar70);
    *(float *)((long)&in_RDI->field_0 + 0x4c) =
         fVar122 * (fVar57 * fVar30 + fVar71 * fVar29 + fVar113 * fVar39 + fVar130 * fVar82) +
         fVar94 * (fVar83 * fVar57 + fVar71 * fStack_17c + fVar113 * fStack_19c + fVar130 * fVar54)
         + (fVar33 * fVar57 + fVar71 * fStack_15c + fVar113 * fStack_13c + fVar130 * fVar32) *
           fVar41 + fVar105 * (fVar36 * fVar57 +
                              fVar113 * fVar84 + fVar130 * fVar60 + fVar35 * fVar71);
    *(float *)((long)&in_RDI->field_0 + 0x50) =
         fVar123 * (fVar58 * fVar30 + fVar72 * fVar29 + fVar114 * fVar39 + fVar132 * fVar82) +
         fVar96 * (fVar83 * fVar58 + fVar72 * fStack_178 + fVar114 * fStack_198 + fVar132 * fVar54)
         + (fVar33 * fVar58 + fVar72 * fStack_158 + fVar114 * fStack_138 + fVar132 * fVar32) *
           fVar37 + fVar106 * (fVar36 * fVar58 +
                              fVar114 * fVar84 + fVar132 * fVar60 + fVar35 * fVar72);
    *(float *)((long)&in_RDI->field_0 + 0x54) =
         fVar124 * (fVar59 * fVar30 + fVar73 * fVar29 + fVar115 * fVar39 + fVar134 * fVar82) +
         fVar98 * (fVar83 * fVar59 + fVar73 * fStack_174 + fVar115 * fStack_194 + fVar134 * fVar54)
         + (fVar33 * fVar59 + fVar73 * fStack_154 + fVar115 * fStack_134 + fVar134 * fVar32) *
           fVar86 + fVar107 * (fVar36 * fVar59 +
                              fVar115 * fVar84 + fVar134 * fVar60 + fVar35 * fVar73);
    *(float *)((long)&in_RDI->field_0 + 0x58) =
         fVar125 * (fVar61 * fVar30 + fVar74 * fVar29 + fVar116 * fVar39 + fVar136 * fVar82) +
         fVar100 * (fVar83 * fVar61 + fVar74 * fStack_170 + fVar116 * fStack_190 + fVar136 * fVar54)
         + (fVar33 * fVar61 + fVar74 * fStack_150 + fVar116 * fStack_130 + fVar136 * fVar32) *
           fVar44 + fVar108 * (fVar36 * fVar61 +
                              fVar116 * fVar84 + fVar136 * fVar60 + fVar35 * fVar74);
    *(float *)((long)&in_RDI->field_0 + 0x5c) = fVar62 + fVar62 + auVar23._28_4_ + fVar62;
    return in_RDI;
  default:
    auVar22 = ZEXT816(0);
    (in_RDI->field_0).field_0.z.field_0 =
         (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar22);
    (in_RDI->field_0).field_0.y.field_0 =
         (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar22);
    *(undefined1 (*) [32])&in_RDI->field_0 = ZEXT1632(auVar22);
    return in_RDI;
  case '\x06':
    fVar48 = patch->patch_v[0][0].field_0.m128[0];
    auVar22 = ZEXT416((uint)(patch->patch_v[0][1].field_0.m128[0] -
                            patch->patch_v[0][0].field_0.m128[0]));
    auVar22 = vshufps_avx(auVar22,auVar22,0);
    fVar28 = (uu->field_0).v[0];
    fVar31 = (uu->field_0).v[1];
    fVar34 = (uu->field_0).v[2];
    fVar38 = (uu->field_0).v[3];
    fVar42 = (uu->field_0).v[4];
    fVar46 = (uu->field_0).v[5];
    fVar91 = (uu->field_0).v[6];
    fVar21 = patch->patch_v[0][3].field_0.m128[0];
    auVar63._0_4_ = fVar48 + fVar28 * auVar22._0_4_;
    auVar63._4_4_ = fVar48 + fVar31 * auVar22._4_4_;
    auVar63._8_4_ = fVar48 + fVar34 * auVar22._8_4_;
    auVar63._12_4_ = fVar48 + fVar38 * auVar22._12_4_;
    auVar63._16_4_ = fVar48 + fVar42 * auVar22._0_4_;
    auVar63._20_4_ = fVar48 + fVar46 * auVar22._4_4_;
    auVar63._24_4_ = fVar48 + fVar91 * auVar22._8_4_;
    auVar63._28_4_ = fVar48 + auVar22._12_4_;
    auVar22 = ZEXT416((uint)(patch->patch_v[0][2].field_0.m128[0] -
                            patch->patch_v[0][3].field_0.m128[0]));
    auVar22 = vshufps_avx(auVar22,auVar22,0);
    auVar52._0_4_ = fVar21 + fVar28 * auVar22._0_4_;
    auVar52._4_4_ = fVar21 + fVar31 * auVar22._4_4_;
    auVar52._8_4_ = fVar21 + fVar34 * auVar22._8_4_;
    auVar52._12_4_ = fVar21 + fVar38 * auVar22._12_4_;
    auVar52._16_4_ = fVar21 + fVar42 * auVar22._0_4_;
    auVar52._20_4_ = fVar21 + fVar46 * auVar22._4_4_;
    auVar52._24_4_ = fVar21 + fVar91 * auVar22._8_4_;
    auVar52._28_4_ = fVar21 + auVar22._12_4_;
    auVar52 = vsubps_avx(auVar52,auVar63);
    fVar93 = (vv->field_0).v[0];
    fVar95 = (vv->field_0).v[1];
    fVar97 = (vv->field_0).v[2];
    fVar99 = (vv->field_0).v[3];
    fVar43 = (vv->field_0).v[4];
    fVar137 = (vv->field_0).v[5];
    fVar53 = (vv->field_0).v[6];
    fVar48 = patch->patch_v[0][0].field_0.m128[1];
    auVar22 = ZEXT416((uint)(patch->patch_v[0][1].field_0.m128[1] -
                            patch->patch_v[0][0].field_0.m128[1]));
    auVar22 = vshufps_avx(auVar22,auVar22,0);
    fVar21 = patch->patch_v[0][3].field_0.m128[1];
    auVar68._0_4_ = fVar48 + fVar28 * auVar22._0_4_;
    auVar68._4_4_ = fVar48 + fVar31 * auVar22._4_4_;
    auVar68._8_4_ = fVar48 + fVar34 * auVar22._8_4_;
    auVar68._12_4_ = fVar48 + fVar38 * auVar22._12_4_;
    auVar68._16_4_ = fVar48 + fVar42 * auVar22._0_4_;
    auVar68._20_4_ = fVar48 + fVar46 * auVar22._4_4_;
    auVar68._24_4_ = fVar48 + fVar91 * auVar22._8_4_;
    auVar68._28_4_ = fVar48 + auVar22._12_4_;
    auVar22 = ZEXT416((uint)(patch->patch_v[0][2].field_0.m128[1] -
                            patch->patch_v[0][3].field_0.m128[1]));
    auVar22 = vshufps_avx(auVar22,auVar22,0);
    auVar79._0_4_ = fVar21 + fVar28 * auVar22._0_4_;
    auVar79._4_4_ = fVar21 + fVar31 * auVar22._4_4_;
    auVar79._8_4_ = fVar21 + fVar34 * auVar22._8_4_;
    auVar79._12_4_ = fVar21 + fVar38 * auVar22._12_4_;
    auVar79._16_4_ = fVar21 + fVar42 * auVar22._0_4_;
    auVar79._20_4_ = fVar21 + fVar46 * auVar22._4_4_;
    auVar79._24_4_ = fVar21 + fVar91 * auVar22._8_4_;
    auVar79._28_4_ = fVar21 + auVar22._12_4_;
    auVar79 = vsubps_avx(auVar79,auVar68);
    fVar48 = patch->patch_v[0][0].field_0.m128[2];
    auVar22 = ZEXT416((uint)(patch->patch_v[0][1].field_0.m128[2] -
                            patch->patch_v[0][0].field_0.m128[2]));
    auVar22 = vshufps_avx(auVar22,auVar22,0);
    auVar80._0_4_ = fVar48 + fVar28 * auVar22._0_4_;
    auVar80._4_4_ = fVar48 + fVar31 * auVar22._4_4_;
    auVar80._8_4_ = fVar48 + fVar34 * auVar22._8_4_;
    auVar80._12_4_ = fVar48 + fVar38 * auVar22._12_4_;
    auVar80._16_4_ = fVar48 + fVar42 * auVar22._0_4_;
    auVar80._20_4_ = fVar48 + fVar46 * auVar22._4_4_;
    auVar80._24_4_ = fVar48 + fVar91 * auVar22._8_4_;
    auVar80._28_4_ = fVar48 + auVar22._12_4_;
    fVar48 = patch->patch_v[0][3].field_0.m128[2];
    auVar22 = ZEXT416((uint)(patch->patch_v[0][2].field_0.m128[2] -
                            patch->patch_v[0][3].field_0.m128[2]));
    auVar22 = vshufps_avx(auVar22,auVar22,0);
    auVar24._0_4_ = fVar48 + fVar28 * auVar22._0_4_;
    auVar24._4_4_ = fVar48 + fVar31 * auVar22._4_4_;
    auVar24._8_4_ = fVar48 + fVar34 * auVar22._8_4_;
    auVar24._12_4_ = fVar48 + fVar38 * auVar22._12_4_;
    auVar24._16_4_ = fVar48 + fVar42 * auVar22._0_4_;
    auVar24._20_4_ = fVar48 + fVar46 * auVar22._4_4_;
    auVar24._24_4_ = fVar48 + fVar91 * auVar22._8_4_;
    auVar24._28_4_ = fVar48 + (uu->field_0).v[7];
    auVar24 = vsubps_avx(auVar24,auVar80);
    fVar21 = auVar80._0_4_ + fVar93 * auVar24._0_4_;
    fVar28 = auVar80._4_4_ + fVar95 * auVar24._4_4_;
    fVar31 = auVar80._8_4_ + fVar97 * auVar24._8_4_;
    fVar34 = auVar80._12_4_ + fVar99 * auVar24._12_4_;
    fVar38 = auVar80._16_4_ + fVar43 * auVar24._16_4_;
    fVar42 = auVar80._20_4_ + fVar137 * auVar24._20_4_;
    fVar46 = auVar80._24_4_ + fVar53 * auVar24._24_4_;
    fVar48 = auVar80._28_4_ + auVar24._28_4_;
    *(float *)&in_RDI->field_0 = auVar63._0_4_ + fVar93 * auVar52._0_4_;
    *(float *)((long)&in_RDI->field_0 + 4) = auVar63._4_4_ + fVar95 * auVar52._4_4_;
    *(float *)((long)&in_RDI->field_0 + 8) = auVar63._8_4_ + fVar97 * auVar52._8_4_;
    *(float *)((long)&in_RDI->field_0 + 0xc) = auVar63._12_4_ + fVar99 * auVar52._12_4_;
    *(float *)((long)&in_RDI->field_0 + 0x10) = auVar63._16_4_ + fVar43 * auVar52._16_4_;
    *(float *)((long)&in_RDI->field_0 + 0x14) = auVar63._20_4_ + fVar137 * auVar52._20_4_;
    *(float *)((long)&in_RDI->field_0 + 0x18) = auVar63._24_4_ + fVar53 * auVar52._24_4_;
    *(float *)((long)&in_RDI->field_0 + 0x1c) = auVar63._28_4_ + auVar52._28_4_;
    *(float *)((long)&in_RDI->field_0 + 0x20) = auVar68._0_4_ + fVar93 * auVar79._0_4_;
    *(float *)((long)&in_RDI->field_0 + 0x24) = auVar68._4_4_ + fVar95 * auVar79._4_4_;
    *(float *)((long)&in_RDI->field_0 + 0x28) = auVar68._8_4_ + fVar97 * auVar79._8_4_;
    *(float *)((long)&in_RDI->field_0 + 0x2c) = auVar68._12_4_ + fVar99 * auVar79._12_4_;
    *(float *)((long)&in_RDI->field_0 + 0x30) = auVar68._16_4_ + fVar43 * auVar79._16_4_;
    *(float *)((long)&in_RDI->field_0 + 0x34) = auVar68._20_4_ + fVar137 * auVar79._20_4_;
    *(float *)((long)&in_RDI->field_0 + 0x38) = auVar68._24_4_ + fVar53 * auVar79._24_4_;
    *(float *)((long)&in_RDI->field_0 + 0x3c) = auVar68._28_4_ + auVar79._28_4_;
    goto LAB_00ea326d;
  }
  fVar21 = auVar119._0_4_ * fVar19 + fVar21;
  fVar28 = auVar119._4_4_ * fVar25 + fVar28;
  fVar31 = auVar119._8_4_ * fVar81 + fVar31;
  fVar34 = auVar119._12_4_ * fVar26 + fVar34;
  fVar38 = auVar119._16_4_ * fVar27 + fVar38;
  fVar42 = auVar119._20_4_ * fVar39 + fVar42;
  fVar46 = auVar119._24_4_ * fVar82 + fVar46;
  fVar48 = fVar48 + fVar91;
  *(float *)&in_RDI->field_0 = fVar105;
  *(float *)((long)&in_RDI->field_0 + 4) = fVar132;
  *(float *)((long)&in_RDI->field_0 + 8) = fVar106;
  *(float *)((long)&in_RDI->field_0 + 0xc) = fVar134;
  *(float *)((long)&in_RDI->field_0 + 0x10) = fVar107;
  *(float *)((long)&in_RDI->field_0 + 0x14) = fVar136;
  *(float *)((long)&in_RDI->field_0 + 0x18) = fVar108;
  *(float *)((long)&in_RDI->field_0 + 0x1c) = fVar109;
  *(float *)((long)&in_RDI->field_0 + 0x20) = fVar110;
  *(float *)((long)&in_RDI->field_0 + 0x24) = fVar111;
  *(float *)((long)&in_RDI->field_0 + 0x28) = fVar112;
  *(float *)((long)&in_RDI->field_0 + 0x2c) = fVar113;
  *(float *)((long)&in_RDI->field_0 + 0x30) = fVar114;
  *(float *)((long)&in_RDI->field_0 + 0x34) = fVar115;
  *(float *)((long)&in_RDI->field_0 + 0x38) = fVar116;
  *(float *)((long)&in_RDI->field_0 + 0x3c) = fVar117;
LAB_00ea326d:
  *(float *)((long)&in_RDI->field_0 + 0x40) = fVar21;
  *(float *)((long)&in_RDI->field_0 + 0x44) = fVar28;
  *(float *)((long)&in_RDI->field_0 + 0x48) = fVar31;
  *(float *)((long)&in_RDI->field_0 + 0x4c) = fVar34;
  *(float *)((long)&in_RDI->field_0 + 0x50) = fVar38;
  *(float *)((long)&in_RDI->field_0 + 0x54) = fVar42;
  *(float *)((long)&in_RDI->field_0 + 0x58) = fVar46;
  *(float *)((long)&in_RDI->field_0 + 0x5c) = fVar48;
  return in_RDI;
}

Assistant:

Vec3<simdf> patchEval(const SubdivPatch1Base& patch, const simdf& uu, const simdf& vv) 
    {
      if (likely(patch.type == SubdivPatch1Base::BEZIER_PATCH))
        return ((BezierPatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::BSPLINE_PATCH))
        return ((BSplinePatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::GREGORY_PATCH))
        return ((DenseGregoryPatch3fa*)patch.patch_v)->eval(uu,vv);
      else if (likely(patch.type == SubdivPatch1Base::BILINEAR_PATCH))
        return ((BilinearPatch3fa*)patch.patch_v)->eval(uu,vv);
      return Vec3<simdf>( zero );
    }